

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  float *pfVar20;
  undefined1 (*pauVar21) [32];
  long lVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar26;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar64 [32];
  __m256 afVar49;
  undefined1 auVar104 [56];
  undefined1 auVar65 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar50 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar55 [32];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar36 [16];
  float fVar102;
  float fVar103;
  float fVar105;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar61 [32];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar109 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar122 [16];
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar160 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar161 [64];
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar175;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 in_ZMM3 [64];
  float fVar179;
  float fVar197;
  float fVar198;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar199;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar216;
  undefined1 auVar205 [16];
  float fVar220;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 in_ZMM5 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  __m128 afVar322;
  unary_op_tan op;
  unary_op_tan local_161;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  long local_138;
  undefined8 local_130;
  Mat *local_128;
  undefined1 local_120 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_17 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  undefined1 auVar136 [32];
  undefined1 auVar140 [32];
  
  auVar58 = _DAT_00555120;
  auVar134 = _DAT_00555100;
  auVar111 = in_ZMM3._0_16_;
  auVar142 = in_ZMM5._0_16_;
  local_128 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_avx[-3])) {
  case 0:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47._16_4_ = 0x7fffffff;
      auVar47._20_4_ = 0x7fffffff;
      auVar47._24_4_ = 0x7fffffff;
      auVar47._28_4_ = 0x7fffffff;
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar180._8_8_ = 0x8000000000000000;
      auVar180._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar142,auVar142);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = vandps_avx(auVar47,*pauVar21);
            *pauVar21 = auVar57;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = vandps_avx(auVar109,*(undefined1 (*) [16])*pauVar21);
          *(undefined1 (*) [16])*pauVar21 = auVar142;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar221._8_8_ = 0;
          auVar221._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar221,0x44);
          auVar142 = vorps_avx(auVar205,auVar180);
          auVar131 = vorps_avx(auVar205,auVar180);
          auVar205 = vorps_avx(auVar205,auVar180);
          uVar25 = 0;
          do {
            auVar260._8_8_ = 0;
            auVar260._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar260,0x44);
            auVar278._16_16_ = auVar296;
            auVar278._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar278,auVar134);
            auVar157 = vorps_avx(auVar278,auVar58);
            auVar304._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar304._8_4_ = auVar157._24_4_;
            auVar304._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar304,auVar142);
            auVar261._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar261._8_4_ = auVar157._8_4_;
            auVar261._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar261,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar305._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar305._8_4_ = auVar57._24_4_;
            auVar305._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar305,auVar142);
            auVar290._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar290._8_4_ = auVar57._8_4_;
            auVar290._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar290,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar279._16_16_ = auVar296;
            auVar279._0_16_ = auVar36;
            auVar57 = vmaskmovps_avx(auVar279,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar57 = vandps_avx(auVar57,auVar47);
            auVar57 = vmaskmovps_avx(auVar279,auVar57);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 1:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar190._8_8_ = 0x8000000000000000;
      auVar190._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar142,auVar142);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = *pauVar21;
            auVar231._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
            auVar231._8_4_ = auVar57._8_4_ ^ 0x80000000;
            auVar231._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar231._16_4_ = auVar57._16_4_ ^ 0x80000000;
            auVar231._20_4_ = auVar57._20_4_ ^ 0x80000000;
            auVar231._24_4_ = auVar57._24_4_ ^ 0x80000000;
            auVar231._28_4_ = auVar57._28_4_ ^ 0x80000000;
            *pauVar21 = auVar231;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = *(undefined1 (*) [16])*pauVar21;
          auVar226._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
          auVar226._8_4_ = auVar142._8_4_ ^ 0x80000000;
          auVar226._12_4_ = auVar142._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar21 = auVar226;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar227._8_8_ = 0;
          auVar227._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar227,0x44);
          auVar142 = vorps_avx(auVar205,auVar190);
          auVar131 = vorps_avx(auVar205,auVar190);
          auVar205 = vorps_avx(auVar205,auVar190);
          uVar25 = 0;
          do {
            auVar272._8_8_ = 0;
            auVar272._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar272,0x44);
            auVar285._16_16_ = auVar296;
            auVar285._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar285,auVar134);
            auVar157 = vorps_avx(auVar285,auVar58);
            auVar308._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar308._8_4_ = auVar157._24_4_;
            auVar308._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar308,auVar142);
            auVar273._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar273._8_4_ = auVar157._8_4_;
            auVar273._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar273,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar309._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar309._8_4_ = auVar57._24_4_;
            auVar309._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar309,auVar142);
            auVar295._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar295._8_4_ = auVar57._8_4_;
            auVar295._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar295,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar286._16_16_ = auVar296;
            auVar286._0_16_ = auVar36;
            auVar57 = vmaskmovps_avx(auVar286,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar303._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
            auVar303._8_4_ = auVar57._8_4_ ^ 0x80000000;
            auVar303._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar303._16_4_ = auVar57._16_4_ ^ 0x80000000;
            auVar303._20_4_ = auVar57._20_4_ ^ 0x80000000;
            auVar303._24_4_ = auVar57._24_4_ ^ 0x80000000;
            auVar303._28_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar57 = vmaskmovps_avx(auVar286,auVar303);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 2:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar149._8_8_ = 0x8000000000000000;
      auVar149._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar111,auVar111);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = vroundps_avx(*pauVar21,1);
            *pauVar21 = auVar57;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = vroundps_avx(*(undefined1 (*) [16])*pauVar21,1);
          *(undefined1 (*) [16])*pauVar21 = auVar142;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar186._8_8_ = 0;
          auVar186._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar186,0x44);
          auVar142 = vorps_avx(auVar205,auVar149);
          auVar131 = vorps_avx(auVar205,auVar149);
          auVar205 = vorps_avx(auVar205,auVar149);
          uVar25 = 0;
          do {
            auVar235._8_8_ = 0;
            auVar235._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar235,0x44);
            auVar244._16_16_ = auVar296;
            auVar244._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar244,auVar134);
            auVar157 = vorps_avx(auVar244,auVar58);
            auVar266._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar266._8_4_ = auVar157._24_4_;
            auVar266._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar266,auVar142);
            auVar236._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar236._8_4_ = auVar157._8_4_;
            auVar236._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar236,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar267._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar267._8_4_ = auVar57._24_4_;
            auVar267._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar267,auVar142);
            auVar251._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar251._8_4_ = auVar57._8_4_;
            auVar251._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar251,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar245._16_16_ = auVar296;
            auVar245._0_16_ = auVar36;
            auVar57 = vmaskmovps_avx(auVar245,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar57 = vroundps_avx(auVar57,9);
            auVar57 = vmaskmovps_avx(auVar245,auVar57);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 3:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar150._8_8_ = 0x8000000000000000;
      auVar150._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar111,auVar111);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = vroundps_avx(*pauVar21,2);
            *pauVar21 = auVar57;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = vroundps_avx(*(undefined1 (*) [16])*pauVar21,2);
          *(undefined1 (*) [16])*pauVar21 = auVar142;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar188._8_8_ = 0;
          auVar188._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar188,0x44);
          auVar142 = vorps_avx(auVar205,auVar150);
          auVar131 = vorps_avx(auVar205,auVar150);
          auVar205 = vorps_avx(auVar205,auVar150);
          uVar25 = 0;
          do {
            auVar237._8_8_ = 0;
            auVar237._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar237,0x44);
            auVar246._16_16_ = auVar296;
            auVar246._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar246,auVar134);
            auVar157 = vorps_avx(auVar246,auVar58);
            auVar270._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar270._8_4_ = auVar157._24_4_;
            auVar270._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar270,auVar142);
            auVar238._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar238._8_4_ = auVar157._8_4_;
            auVar238._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar238,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar271._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar271._8_4_ = auVar57._24_4_;
            auVar271._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar271,auVar142);
            auVar252._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar252._8_4_ = auVar57._8_4_;
            auVar252._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar252,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar247._16_16_ = auVar296;
            auVar247._0_16_ = auVar36;
            auVar57 = vmaskmovps_avx(auVar247,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar57 = vroundps_avx(auVar57,10);
            auVar57 = vmaskmovps_avx(auVar247,auVar57);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 4:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar145._8_8_ = 0x8000000000000000;
      auVar145._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar111,auVar111);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar3._4_4_ = *(float *)(*pauVar21 + 4) * *(float *)(*pauVar21 + 4);
            auVar3._0_4_ = *(float *)*pauVar21 * *(float *)*pauVar21;
            auVar3._8_4_ = *(float *)(*pauVar21 + 8) * *(float *)(*pauVar21 + 8);
            auVar3._12_4_ = *(float *)(*pauVar21 + 0xc) * *(float *)(*pauVar21 + 0xc);
            auVar3._16_4_ = *(float *)(*pauVar21 + 0x10) * *(float *)(*pauVar21 + 0x10);
            auVar3._20_4_ = *(float *)(*pauVar21 + 0x14) * *(float *)(*pauVar21 + 0x14);
            auVar3._24_4_ = *(float *)(*pauVar21 + 0x18) * *(float *)(*pauVar21 + 0x18);
            auVar3._28_4_ = *(undefined4 *)(*pauVar21 + 0x1c);
            *pauVar21 = auVar3;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar182._0_4_ = *(float *)*pauVar21 * *(float *)*pauVar21;
          auVar182._4_4_ = *(float *)(*pauVar21 + 4) * *(float *)(*pauVar21 + 4);
          auVar182._8_4_ = *(float *)(*pauVar21 + 8) * *(float *)(*pauVar21 + 8);
          auVar182._12_4_ = *(float *)(*pauVar21 + 0xc) * *(float *)(*pauVar21 + 0xc);
          *(undefined1 (*) [16])*pauVar21 = auVar182;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar183._8_8_ = 0;
          auVar183._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar183,0x44);
          auVar142 = vorps_avx(auVar205,auVar145);
          auVar131 = vorps_avx(auVar205,auVar145);
          auVar205 = vorps_avx(auVar205,auVar145);
          uVar25 = 0;
          do {
            auVar233._8_8_ = 0;
            auVar233._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar233,0x44);
            auVar241._16_16_ = auVar296;
            auVar241._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar241,auVar134);
            auVar157 = vorps_avx(auVar241,auVar58);
            auVar263._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar263._8_4_ = auVar157._24_4_;
            auVar263._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar263,auVar142);
            auVar234._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar234._8_4_ = auVar157._8_4_;
            auVar234._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar234,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar264._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar264._8_4_ = auVar57._24_4_;
            auVar264._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar264,auVar142);
            auVar249._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar249._8_4_ = auVar57._8_4_;
            auVar249._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar249,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar242._16_16_ = auVar296;
            auVar242._0_16_ = auVar36;
            auVar57 = vmaskmovps_avx(auVar242,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar4._4_4_ = auVar57._4_4_ * auVar57._4_4_;
            auVar4._0_4_ = auVar57._0_4_ * auVar57._0_4_;
            auVar4._8_4_ = auVar57._8_4_ * auVar57._8_4_;
            auVar4._12_4_ = auVar57._12_4_ * auVar57._12_4_;
            auVar4._16_4_ = auVar57._16_4_ * auVar57._16_4_;
            auVar4._20_4_ = auVar57._20_4_ * auVar57._20_4_;
            auVar4._24_4_ = auVar57._24_4_ * auVar57._24_4_;
            auVar4._28_4_ = auVar57._28_4_;
            auVar57 = vmaskmovps_avx(auVar242,auVar4);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 5:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar158._8_4_ = 0x7fffffff;
      auVar158._0_8_ = 0x7fffffff7fffffff;
      auVar158._12_4_ = 0x7fffffff;
      auVar158._16_4_ = 0x7fffffff;
      auVar158._20_4_ = 0x7fffffff;
      auVar158._24_4_ = 0x7fffffff;
      auVar158._28_4_ = 0x7fffffff;
      auVar172._8_4_ = 0x800000;
      auVar172._0_8_ = 0x80000000800000;
      auVar172._12_4_ = 0x800000;
      auVar172._16_4_ = 0x800000;
      auVar172._20_4_ = 0x800000;
      auVar172._24_4_ = 0x800000;
      auVar172._28_4_ = 0x800000;
      auVar297._8_8_ = 0x8000000000000000;
      auVar297._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = *pauVar21;
            auVar157 = vrsqrtps_avx(auVar57);
            fVar26 = auVar57._0_4_ * auVar157._0_4_;
            fVar102 = auVar57._4_4_ * auVar157._4_4_;
            fVar103 = auVar57._8_4_ * auVar157._8_4_;
            fVar105 = auVar57._12_4_ * auVar157._12_4_;
            fVar106 = auVar57._16_4_ * auVar157._16_4_;
            fVar107 = auVar57._20_4_ * auVar157._20_4_;
            fVar108 = auVar57._24_4_ * auVar157._24_4_;
            auVar8._4_4_ = fVar102 * -0.5 * (fVar102 * auVar157._4_4_ + -3.0);
            auVar8._0_4_ = fVar26 * -0.5 * (fVar26 * auVar157._0_4_ + -3.0);
            auVar8._8_4_ = fVar103 * -0.5 * (fVar103 * auVar157._8_4_ + -3.0);
            auVar8._12_4_ = fVar105 * -0.5 * (fVar105 * auVar157._12_4_ + -3.0);
            auVar8._16_4_ = fVar106 * -0.5 * (fVar106 * auVar157._16_4_ + -3.0);
            auVar8._20_4_ = fVar107 * -0.5 * (fVar107 * auVar157._20_4_ + -3.0);
            auVar8._24_4_ = fVar108 * -0.5 * (fVar108 * auVar157._24_4_ + -3.0);
            auVar8._28_4_ = auVar157._28_4_ + -3.0;
            auVar57 = vandps_avx(auVar57,auVar158);
            auVar57 = vcmpps_avx(auVar172,auVar57,2);
            auVar57 = vandps_avx(auVar57,auVar8);
            *pauVar21 = auVar57;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        auVar317._8_4_ = 0x800000;
        auVar317._0_8_ = 0x80000000800000;
        auVar315._8_4_ = 0x7fffffff;
        auVar315._0_8_ = 0x7fffffff7fffffff;
        auVar317._12_4_ = 0x800000;
        auVar315._12_4_ = 0x7fffffff;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = *(undefined1 (*) [16])*pauVar21;
          auVar131 = vrsqrtps_avx(auVar142);
          fVar26 = auVar142._0_4_ * auVar131._0_4_;
          fVar102 = auVar142._4_4_ * auVar131._4_4_;
          fVar103 = auVar142._8_4_ * auVar131._8_4_;
          fVar105 = auVar142._12_4_ * auVar131._12_4_;
          in_ZMM6 = ZEXT1664(CONCAT412(fVar105,CONCAT48(fVar103,CONCAT44(fVar102,fVar26))));
          auVar207._0_4_ = fVar26 * -0.5 * (fVar26 * auVar131._0_4_ + -3.0);
          auVar207._4_4_ = fVar102 * -0.5 * (fVar102 * auVar131._4_4_ + -3.0);
          auVar207._8_4_ = fVar103 * -0.5 * (fVar103 * auVar131._8_4_ + -3.0);
          auVar207._12_4_ = fVar105 * -0.5 * (fVar105 * auVar131._12_4_ + -3.0);
          auVar142 = vandps_avx(auVar315,auVar142);
          auVar142 = vcmpps_avx(auVar317,auVar142,2);
          auVar142 = vandps_avx(auVar142,auVar207);
          *(undefined1 (*) [16])*pauVar21 = auVar142;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar312._8_8_ = 0;
          auVar312._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar312,0x44);
          auVar142 = vorps_avx(auVar205,auVar297);
          auVar131 = vorps_avx(auVar205,auVar297);
          auVar205 = vorps_avx(auVar205,auVar297);
          uVar25 = 0;
          do {
            auVar318._8_8_ = 0;
            auVar318._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar318,0x44);
            auVar321._16_16_ = auVar296;
            auVar321._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar321,auVar134);
            auVar157 = vorps_avx(auVar321,auVar58);
            auVar208._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar208._8_4_ = auVar157._24_4_;
            auVar208._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar208,auVar142);
            auVar319._8_4_ = auVar157._8_4_;
            auVar319._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar319._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar319,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar320._8_4_ = auVar57._24_4_;
            auVar320._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar320._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar320,auVar142);
            auVar191._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar191._8_4_ = auVar57._8_4_;
            auVar191._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar191,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar111 ^ auVar36,auVar111 ^ auVar296);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar195._16_16_ = auVar296;
            auVar195._0_16_ = auVar36;
            auVar157 = vmaskmovps_avx(auVar195,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar57 = vrsqrtps_avx(auVar157);
            fVar26 = auVar57._0_4_ * auVar157._0_4_;
            fVar102 = auVar57._4_4_ * auVar157._4_4_;
            fVar103 = auVar57._8_4_ * auVar157._8_4_;
            fVar105 = auVar57._12_4_ * auVar157._12_4_;
            fVar106 = auVar57._16_4_ * auVar157._16_4_;
            fVar107 = auVar57._20_4_ * auVar157._20_4_;
            fVar108 = auVar57._24_4_ * auVar157._24_4_;
            auVar9._4_4_ = fVar102 * -0.5 * (auVar57._4_4_ * fVar102 + -3.0);
            auVar9._0_4_ = fVar26 * -0.5 * (auVar57._0_4_ * fVar26 + -3.0);
            auVar9._8_4_ = fVar103 * -0.5 * (auVar57._8_4_ * fVar103 + -3.0);
            auVar9._12_4_ = fVar105 * -0.5 * (auVar57._12_4_ * fVar105 + -3.0);
            auVar9._16_4_ = fVar106 * -0.5 * (auVar57._16_4_ * fVar106 + -3.0);
            auVar9._20_4_ = fVar107 * -0.5 * (auVar57._20_4_ * fVar107 + -3.0);
            auVar9._24_4_ = fVar108 * -0.5 * (auVar57._24_4_ * fVar108 + -3.0);
            auVar9._28_4_ = in_ZMM6._28_4_ + -3.0;
            in_ZMM6 = ZEXT3264(auVar9);
            auVar57 = vandps_avx(auVar157,auVar158);
            auVar57 = vcmpps_avx(auVar172,auVar57,2);
            auVar57 = vandps_avx(auVar57,auVar9);
            auVar57 = vmaskmovps_avx(auVar195,auVar57);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 6:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar155._8_8_ = 0x8000000000000000;
      auVar155._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar111,auVar111);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = vrsqrtps_avx(*pauVar21);
            *pauVar21 = auVar57;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar21);
          *(undefined1 (*) [16])*pauVar21 = auVar142;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar228._8_8_ = 0;
          auVar228._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar228,0x44);
          auVar142 = vorps_avx(auVar205,auVar155);
          auVar131 = vorps_avx(auVar205,auVar155);
          auVar205 = vorps_avx(auVar205,auVar155);
          uVar25 = 0;
          do {
            auVar275._8_8_ = 0;
            auVar275._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar275,0x44);
            auVar288._16_16_ = auVar296;
            auVar288._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar288,auVar134);
            auVar157 = vorps_avx(auVar288,auVar58);
            auVar310._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar310._8_4_ = auVar157._24_4_;
            auVar310._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar310,auVar142);
            auVar276._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar276._8_4_ = auVar157._8_4_;
            auVar276._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar276,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar311._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar311._8_4_ = auVar57._24_4_;
            auVar311._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar311,auVar142);
            auVar299._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar299._8_4_ = auVar57._8_4_;
            auVar299._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar299,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar289._16_16_ = auVar296;
            auVar289._0_16_ = auVar36;
            auVar157 = vmaskmovps_avx(auVar289,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar57 = vrsqrtps_avx(auVar157);
            fVar26 = auVar57._0_4_;
            fVar102 = auVar57._4_4_;
            fVar103 = auVar57._8_4_;
            fVar105 = auVar57._12_4_;
            fVar106 = auVar57._16_4_;
            fVar107 = auVar57._20_4_;
            fVar108 = auVar57._24_4_;
            auVar12._4_4_ = fVar102 * -0.5 * (auVar157._4_4_ * fVar102 * fVar102 + -3.0);
            auVar12._0_4_ = fVar26 * -0.5 * (auVar157._0_4_ * fVar26 * fVar26 + -3.0);
            auVar12._8_4_ = fVar103 * -0.5 * (auVar157._8_4_ * fVar103 * fVar103 + -3.0);
            auVar12._12_4_ = fVar105 * -0.5 * (auVar157._12_4_ * fVar105 * fVar105 + -3.0);
            auVar12._16_4_ = fVar106 * -0.5 * (auVar157._16_4_ * fVar106 * fVar106 + -3.0);
            auVar12._20_4_ = fVar107 * -0.5 * (auVar157._20_4_ * fVar107 * fVar107 + -3.0);
            auVar12._24_4_ = fVar108 * -0.5 * (auVar157._24_4_ * fVar108 * fVar108 + -3.0);
            auVar12._28_4_ = auVar157._28_4_ + -3.0;
            auVar57 = vmaskmovps_avx(auVar289,auVar12);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 7:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar23) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar258._8_4_ = 0x3f800000;
        auVar258._0_8_ = 0x3f8000003f800000;
        auVar213._8_4_ = 0xc2b0c0a5;
        auVar213._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar194._8_4_ = 0x42b0c0a5;
        auVar194._0_8_ = 0x42b0c0a542b0c0a5;
        auVar258._12_4_ = 0x3f800000;
        auVar213._12_4_ = 0xc2b0c0a5;
        auVar194._12_4_ = 0x42b0c0a5;
        auVar258._16_4_ = 0x3f800000;
        auVar213._16_4_ = 0xc2b0c0a5;
        auVar194._16_4_ = 0x42b0c0a5;
        auVar258._20_4_ = 0x3f800000;
        auVar213._20_4_ = 0xc2b0c0a5;
        auVar194._20_4_ = 0x42b0c0a5;
        auVar316._8_4_ = 0x3f800000;
        auVar316._0_8_ = 0x3f8000003f800000;
        auVar258._24_4_ = 0x3f800000;
        auVar213._24_4_ = 0xc2b0c0a5;
        auVar194._24_4_ = 0x42b0c0a5;
        auVar316._12_4_ = 0x3f800000;
        auVar258._28_4_ = 0x3f800000;
        auVar213._28_4_ = 0xc2b0c0a5;
        auVar194._28_4_ = 0x42b0c0a5;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar134 = vminps_avx(auVar194,*pauVar21);
            auVar58 = vmaxps_avx(auVar134,auVar213);
            auVar139._0_4_ = auVar58._0_4_ * 1.442695 + 0.5;
            auVar139._4_4_ = auVar58._4_4_ * 1.442695 + 0.5;
            auVar139._8_4_ = auVar58._8_4_ * 1.442695 + 0.5;
            auVar139._12_4_ = auVar58._12_4_ * 1.442695 + 0.5;
            auVar139._16_4_ = auVar58._16_4_ * 1.442695 + 0.5;
            auVar139._20_4_ = auVar58._20_4_ * 1.442695 + 0.5;
            auVar139._24_4_ = auVar58._24_4_ * 1.442695 + 0.5;
            auVar139._28_4_ = in_ZMM1._28_4_ + 0.5;
            auVar57 = vroundps_avx(auVar139,1);
            auVar134 = vcmpps_avx(auVar139,auVar57,1);
            auVar134 = vandps_avx(auVar258,auVar134);
            auVar134 = vsubps_avx(auVar57,auVar134);
            fVar26 = auVar58._0_4_ + auVar134._0_4_ * -0.6931472;
            fVar102 = auVar58._4_4_ + auVar134._4_4_ * -0.6931472;
            fVar103 = auVar58._8_4_ + auVar134._8_4_ * -0.6931472;
            fVar105 = auVar58._12_4_ + auVar134._12_4_ * -0.6931472;
            fVar106 = auVar58._16_4_ + auVar134._16_4_ * -0.6931472;
            fVar107 = auVar58._20_4_ + auVar134._20_4_ * -0.6931472;
            fVar108 = auVar58._24_4_ + auVar134._24_4_ * -0.6931472;
            auVar123._0_4_ = (int)auVar134._0_4_;
            auVar123._4_4_ = (int)auVar134._4_4_;
            auVar123._8_4_ = (int)auVar134._8_4_;
            auVar123._12_4_ = (int)auVar134._12_4_;
            auVar140._16_4_ = (int)auVar134._16_4_;
            auVar140._0_16_ = auVar123;
            auVar140._20_4_ = (int)auVar134._20_4_;
            auVar140._24_4_ = (int)auVar134._24_4_;
            auVar140._28_4_ = (int)auVar134._28_4_;
            auVar142 = vpslld_avx(auVar123,0x17);
            auVar111 = vpslld_avx(auVar140._16_16_,0x17);
            auVar111 = vpaddd_avx(auVar316,auVar111);
            auVar142 = vpaddd_avx(auVar316,auVar142);
            in_ZMM1 = ZEXT3264(CONCAT1616(auVar111,auVar142));
            *(float *)*pauVar21 =
                 (fVar26 + 1.0 +
                 fVar26 * fVar26 *
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar142._0_4_;
            *(float *)(*pauVar21 + 4) =
                 (fVar102 + 1.0 +
                 fVar102 * fVar102 *
                 (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                   0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar142._4_4_;
            *(float *)(*pauVar21 + 8) =
                 (fVar103 + 1.0 +
                 fVar103 * fVar103 *
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5)) * auVar142._8_4_;
            *(float *)(*pauVar21 + 0xc) =
                 (fVar105 + 1.0 +
                 fVar105 * fVar105 *
                 (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                   0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar142._12_4_;
            *(float *)(*pauVar21 + 0x10) =
                 (fVar106 + 1.0 +
                 fVar106 * fVar106 *
                 (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                   0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5)) * auVar111._0_4_;
            *(float *)(*pauVar21 + 0x14) =
                 (fVar107 + 1.0 +
                 fVar107 * fVar107 *
                 (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                   0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar111._4_4_;
            *(float *)(*pauVar21 + 0x18) =
                 (fVar108 + 1.0 +
                 fVar108 * fVar108 *
                 (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                   0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar111._8_4_;
            *(float *)(*pauVar21 + 0x1c) = auVar58._28_4_ + auVar57._28_4_ + 1.0 + auVar57._28_4_;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
          } while (iVar24 < iVar23);
          uVar15 = (uint)local_130;
        }
        auVar189._8_4_ = 0x42b0c0a5;
        auVar189._0_8_ = 0x42b0c0a542b0c0a5;
        auVar189._12_4_ = 0x42b0c0a5;
        auVar206._8_4_ = 0xc2b0c0a5;
        auVar206._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar206._12_4_ = 0xc2b0c0a5;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar23) {
          auVar111 = vminps_avx(auVar189,*(undefined1 (*) [16])*pauVar21);
          auVar131 = vmaxps_avx(auVar111,auVar206);
          auVar124._0_4_ = auVar131._0_4_ * 1.442695 + 0.5;
          auVar124._4_4_ = auVar131._4_4_ * 1.442695 + 0.5;
          auVar124._8_4_ = auVar131._8_4_ * 1.442695 + 0.5;
          auVar124._12_4_ = auVar131._12_4_ * 1.442695 + 0.5;
          auVar151._0_4_ = (int)auVar124._0_4_;
          auVar151._4_4_ = (int)auVar124._4_4_;
          auVar151._8_4_ = (int)auVar124._8_4_;
          auVar151._12_4_ = (int)auVar124._12_4_;
          auVar142 = vcvtdq2ps_avx(auVar151);
          auVar111 = vcmpps_avx(auVar124,auVar142,1);
          auVar111 = vandps_avx(auVar316,auVar111);
          auVar111 = vsubps_avx(auVar142,auVar111);
          fVar26 = auVar131._0_4_ + auVar111._0_4_ * -0.6931472;
          fVar102 = auVar131._4_4_ + auVar111._4_4_ * -0.6931472;
          fVar103 = auVar131._8_4_ + auVar111._8_4_ * -0.6931472;
          fVar105 = auVar131._12_4_ + auVar111._12_4_ * -0.6931472;
          auVar125._0_4_ = (int)auVar111._0_4_;
          auVar125._4_4_ = (int)auVar111._4_4_;
          auVar125._8_4_ = (int)auVar111._8_4_;
          auVar125._12_4_ = (int)auVar111._12_4_;
          auVar111 = vpslld_avx(auVar125,0x17);
          auVar111 = vpaddd_avx(auVar316,auVar111);
          in_ZMM1 = ZEXT1664(auVar111);
          *(float *)*pauVar21 =
               (fVar26 + 1.0 +
               fVar26 * fVar26 *
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar111._0_4_;
          *(float *)(*pauVar21 + 4) =
               (fVar102 + 1.0 +
               fVar102 * fVar102 *
               (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar111._4_4_;
          *(float *)(*pauVar21 + 8) =
               (fVar103 + 1.0 +
               fVar103 * fVar103 *
               (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5)) * auVar111._8_4_;
          *(float *)(*pauVar21 + 0xc) =
               (fVar105 + 1.0 +
               fVar105 * fVar105 *
               (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar111._12_4_;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar111 = vpcmpeqd_avx(auVar189,auVar189);
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar16;
          local_c0._0_16_ = vpshufd_avx(auVar34,0x44);
          local_d0 = vpor_avx(local_f0,local_c0._0_16_);
          local_e0 = vpor_avx(local_f0,local_c0._0_16_);
          uVar25 = 0;
          auVar134 = _DAT_00555120;
          local_c0._16_16_ = local_c0._0_16_;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar25;
            auVar142 = vpshufd_avx(auVar35,0x44);
            auVar55._16_16_ = auVar142;
            auVar55._0_16_ = auVar142;
            auVar58 = vorps_avx(auVar55,_DAT_00555100);
            auVar134 = vorps_avx(auVar55,auVar134);
            auVar205 = vpor_avx(local_f0,local_c0._16_16_);
            auVar142 = vpcmpgtq_avx(local_f0 ^ auVar134._16_16_,auVar205);
            auVar131 = vpcmpgtq_avx(local_f0 ^ auVar134._0_16_,local_d0);
            auVar142 = vpackssdw_avx(auVar131,auVar142);
            auVar131 = vpcmpgtq_avx(local_f0 ^ auVar58._16_16_,auVar205);
            auVar126._0_4_ = local_f0._0_4_ ^ auVar58._0_4_;
            auVar126._4_4_ = local_f0._4_4_ ^ auVar58._4_4_;
            auVar126._8_4_ = local_f0._8_4_ ^ auVar58._8_4_;
            auVar126._12_4_ = local_f0._12_4_ ^ auVar58._12_4_;
            auVar205 = vpcmpgtq_avx(auVar126,local_e0);
            auVar131 = vpackssdw_avx(auVar205,auVar131);
            auVar142 = vpackssdw_avx(auVar131 ^ auVar111,auVar142 ^ auVar111);
            auVar131 = vpmovsxwd_avx(auVar142);
            auVar142 = vpunpckhwd_avx(auVar142,auVar142);
            local_a0._16_16_ = auVar142;
            local_a0._0_16_ = auVar131;
            local_120 = vmaskmovps_avx(local_a0,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = expf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_03;
            local_160._8_4_ = extraout_XMM0_Dc_03;
            local_160._12_4_ = extraout_XMM0_Dd_03;
            auVar142 = vmovshdup_avx(local_150);
            auVar78._0_4_ = expf(auVar142._0_4_);
            auVar78._4_60_ = extraout_var_11;
            local_160 = vinsertps_avx(local_160,auVar78._0_16_,0x10);
            auVar142 = vpermilpd_avx(local_150,1);
            auVar79._0_4_ = expf(auVar142._0_4_);
            auVar79._4_60_ = extraout_var_12;
            local_160 = vinsertps_avx(local_160,auVar79._0_16_,0x20);
            auVar142 = vpermilps_avx(local_150,0xff);
            auVar80._0_4_ = expf(auVar142._0_4_);
            auVar80._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_160,auVar80._0_16_,0x30);
            local_160._0_4_ = expf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_04;
            local_160._8_4_ = extraout_XMM0_Dc_04;
            local_160._12_4_ = extraout_XMM0_Dd_04;
            auVar142 = vmovshdup_avx(local_120._0_16_);
            auVar81._0_4_ = expf(auVar142._0_4_);
            auVar81._4_60_ = extraout_var_14;
            local_160 = vinsertps_avx(local_160,auVar81._0_16_,0x10);
            auVar142 = vpermilpd_avx(local_120._0_16_,1);
            auVar82._0_4_ = expf(auVar142._0_4_);
            auVar82._4_60_ = extraout_var_15;
            local_160 = vinsertps_avx(local_160,auVar82._0_16_,0x20);
            auVar142 = vpermilps_avx(local_120._0_16_,0xff);
            auVar83._0_4_ = expf(auVar142._0_4_);
            auVar134 = _DAT_00555120;
            auVar83._4_60_ = extraout_var_16;
            auVar111 = vpcmpeqd_avx(auVar111,auVar111);
            auVar142 = vinsertps_avx(local_160,auVar83._0_16_,0x30);
            auVar56._16_16_ = local_150;
            auVar56._0_16_ = auVar142;
            in_ZMM1 = ZEXT3264(local_a0);
            auVar58 = vmaskmovps_avx(local_a0,auVar56);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar58;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
    break;
  case 8:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar20;
            afVar49 = (__m256)local_80;
            UnaryOp_x86_avx_functor::unary_op_log::func_pack8
                      ((unary_op_log *)&local_161,(__m256 *)local_80);
            *(__m256 *)pfVar20 = afVar49;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        auVar229._8_4_ = 0x3f000000;
        auVar229._0_8_ = 0x3f0000003f000000;
        auVar229._12_4_ = 0x3f000000;
        auVar239._8_4_ = 0xffffff82;
        auVar239._0_8_ = 0xffffff82ffffff82;
        auVar239._12_4_ = 0xffffff82;
        auVar255._8_4_ = 0x3f3504f3;
        auVar255._0_8_ = 0x3f3504f33f3504f3;
        auVar255._12_4_ = 0x3f3504f3;
        auVar300._8_4_ = 0x3f800000;
        auVar300._0_8_ = 0x3f8000003f800000;
        auVar300._12_4_ = 0x3f800000;
        auVar211._8_4_ = 0x3e4cceac;
        auVar211._0_8_ = 0x3e4cceac3e4cceac;
        auVar211._12_4_ = 0x3e4cceac;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar23) {
          auVar43._8_4_ = 0x800000;
          auVar43._0_8_ = 0x80000000800000;
          auVar43._12_4_ = 0x800000;
          auVar111 = vmaxps_avx(auVar43,*(undefined1 (*) [16])pfVar20);
          auVar142 = vpsrld_avx(auVar111,0x17);
          auVar142 = vpaddd_avx(auVar142,auVar239);
          auVar156._8_4_ = 0x807fffff;
          auVar156._0_8_ = 0x807fffff807fffff;
          auVar156._12_4_ = 0x807fffff;
          auVar111 = vandps_avx(auVar111,auVar156);
          auVar205 = vorps_avx(auVar111,auVar229);
          auVar131 = vcvtdq2ps_avx(auVar142);
          auVar142 = vcmpps_avx(auVar205,auVar255,1);
          auVar111 = vandps_avx(auVar142,auVar205);
          fVar26 = auVar205._0_4_ + -1.0 + auVar111._0_4_;
          fVar102 = auVar205._4_4_ + -1.0 + auVar111._4_4_;
          fVar103 = auVar205._8_4_ + -1.0 + auVar111._8_4_;
          fVar105 = auVar205._12_4_ + -1.0 + auVar111._12_4_;
          auVar111 = vandps_avx(auVar300,auVar142);
          auVar111 = vsubps_avx(auVar131,auVar111);
          auVar44._0_4_ =
               auVar111._0_4_ * 0.6931472 + fVar26 +
               fVar26 * fVar26 *
               (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                     -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                  0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5);
          auVar44._4_4_ =
               auVar111._4_4_ * 0.6931472 + fVar102 +
               fVar102 * fVar102 *
               (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102 +
                     -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102 +
                  0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 + -0.5);
          auVar44._8_4_ =
               auVar111._8_4_ * 0.6931472 + fVar103 +
               fVar103 * fVar103 *
               (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) * fVar103 +
                     -0.12420141) * fVar103 + 0.14249323) * fVar103 + -0.16668057) * fVar103 +
                  0.20000714) * fVar103 + -0.24999994) * fVar103 + 0.3333333) * fVar103 + -0.5);
          auVar44._12_4_ =
               auVar111._12_4_ * 0.6931472 + fVar105 +
               fVar105 * fVar105 *
               (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) * fVar105 +
                     -0.12420141) * fVar105 + 0.14249323) * fVar105 + -0.16668057) * fVar105 +
                  0.20000714) * fVar105 + -0.24999994) * fVar105 + 0.3333333) * fVar105 + -0.5);
          *(undefined1 (*) [16])pfVar20 = auVar44;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar111 = vpcmpeqd_avx(auVar211,auVar211);
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar16;
          auVar142 = vpshufd_avx(auVar45,0x44);
          local_c0._16_16_ = auVar142;
          local_c0._0_16_ = auVar142;
          local_d0 = vpor_avx(auVar142,local_f0);
          local_e0 = vpor_avx(auVar142,local_f0);
          uVar25 = 0;
          auVar134 = _DAT_00555120;
          do {
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar25;
            auVar142 = vpshufd_avx(auVar46,0x44);
            auVar63._16_16_ = auVar142;
            auVar63._0_16_ = auVar142;
            auVar58 = vorps_avx(auVar63,_DAT_00555100);
            auVar134 = vorps_avx(auVar63,auVar134);
            auVar205 = vpor_avx(local_c0._16_16_,local_f0);
            auVar142 = vpcmpgtq_avx(auVar134._16_16_ ^ local_f0,auVar205);
            auVar131 = vpcmpgtq_avx(auVar134._0_16_ ^ local_f0,local_d0);
            auVar142 = vpackssdw_avx(auVar131,auVar142);
            auVar131 = vpcmpgtq_avx(auVar58._16_16_ ^ local_f0,auVar205);
            auVar133._0_4_ = auVar58._0_4_ ^ local_f0._0_4_;
            auVar133._4_4_ = auVar58._4_4_ ^ local_f0._4_4_;
            auVar133._8_4_ = auVar58._8_4_ ^ local_f0._8_4_;
            auVar133._12_4_ = auVar58._12_4_ ^ local_f0._12_4_;
            auVar205 = vpcmpgtq_avx(auVar133,local_e0);
            auVar131 = vpackssdw_avx(auVar205,auVar131);
            auVar142 = vpackssdw_avx(auVar131 ^ auVar111,auVar142 ^ auVar111);
            auVar131 = vpmovsxwd_avx(auVar142);
            auVar142 = vpunpckhwd_avx(auVar142,auVar142);
            local_a0._16_16_ = auVar142;
            local_a0._0_16_ = auVar131;
            local_120 = vmaskmovps_avx(local_a0,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = logf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_09;
            local_160._8_4_ = extraout_XMM0_Dc_09;
            local_160._12_4_ = extraout_XMM0_Dd_09;
            auVar142 = vmovshdup_avx(local_150);
            auVar96._0_4_ = logf(auVar142._0_4_);
            auVar96._4_60_ = extraout_var_29;
            local_160 = vinsertps_avx(local_160,auVar96._0_16_,0x10);
            auVar142 = vpermilpd_avx(local_150,1);
            auVar97._0_4_ = logf(auVar142._0_4_);
            auVar97._4_60_ = extraout_var_30;
            local_160 = vinsertps_avx(local_160,auVar97._0_16_,0x20);
            auVar142 = vpermilps_avx(local_150,0xff);
            auVar98._0_4_ = logf(auVar142._0_4_);
            auVar98._4_60_ = extraout_var_31;
            local_150 = vinsertps_avx(local_160,auVar98._0_16_,0x30);
            local_160._0_4_ = logf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_10;
            local_160._8_4_ = extraout_XMM0_Dc_10;
            local_160._12_4_ = extraout_XMM0_Dd_10;
            auVar142 = vmovshdup_avx(local_120._0_16_);
            auVar99._0_4_ = logf(auVar142._0_4_);
            auVar99._4_60_ = extraout_var_32;
            local_160 = vinsertps_avx(local_160,auVar99._0_16_,0x10);
            auVar142 = vpermilpd_avx(local_120._0_16_,1);
            auVar100._0_4_ = logf(auVar142._0_4_);
            auVar100._4_60_ = extraout_var_33;
            local_160 = vinsertps_avx(local_160,auVar100._0_16_,0x20);
            auVar142 = vpermilps_avx(local_120._0_16_,0xff);
            auVar101._0_4_ = logf(auVar142._0_4_);
            auVar134 = _DAT_00555120;
            auVar101._4_60_ = extraout_var_34;
            auVar111 = vpcmpeqd_avx(auVar111,auVar111);
            auVar142 = vinsertps_avx(local_160,auVar101._0_16_,0x30);
            auVar64._16_16_ = local_150;
            auVar64._0_16_ = auVar142;
            auVar58 = vmaskmovps_avx(local_a0,auVar64);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar58;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 9:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar111 = in_ZMM8._0_16_;
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar20;
            afVar49 = (__m256)local_80;
            UnaryOp_x86_avx_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_161,(__m256 *)local_80);
            auVar111 = in_ZMM8._0_16_;
            *(__m256 *)pfVar20 = afVar49;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        uVar18 = uVar15 | 3;
        auVar111 = vpcmpeqd_avx(auVar111,auVar111);
        in_ZMM8 = ZEXT1664(auVar111);
        auVar293._8_4_ = 2;
        auVar293._0_8_ = 0x200000002;
        auVar293._12_4_ = 2;
        while ((int)uVar18 < iVar23) {
          auVar119._8_4_ = 0x7fffffff;
          auVar119._0_8_ = 0x7fffffff7fffffff;
          auVar119._12_4_ = 0x7fffffff;
          auVar142 = vandps_avx(*(undefined1 (*) [16])pfVar20,auVar119);
          auVar147._0_4_ = (int)(auVar142._0_4_ * 1.2732395);
          auVar147._4_4_ = (int)(auVar142._4_4_ * 1.2732395);
          auVar147._8_4_ = (int)(auVar142._8_4_ * 1.2732395);
          auVar147._12_4_ = (int)(auVar142._12_4_ * 1.2732395);
          auVar205 = vpsubd_avx(auVar147,auVar111);
          auVar166._8_4_ = 0xfffffffe;
          auVar166._0_8_ = 0xfffffffefffffffe;
          auVar166._12_4_ = 0xfffffffe;
          auVar131 = vpand_avx(auVar205,auVar166);
          auVar131 = vcvtdq2ps_avx(auVar131);
          fVar26 = auVar142._0_4_ + auVar131._0_4_ * -0.7853982;
          fVar102 = auVar142._4_4_ + auVar131._4_4_ * -0.7853982;
          fVar103 = auVar142._8_4_ + auVar131._8_4_ * -0.7853982;
          fVar105 = auVar142._12_4_ + auVar131._12_4_ * -0.7853982;
          fVar106 = fVar26 * fVar26;
          fVar107 = fVar102 * fVar102;
          fVar108 = fVar103 * fVar103;
          fVar162 = fVar105 * fVar105;
          auVar120._0_4_ =
               fVar106 * fVar26 * ((fVar106 * -0.00019515296 + 0.008332161) * fVar106 + -0.16666655)
               + fVar26;
          auVar120._4_4_ =
               fVar107 * fVar102 *
               ((fVar107 * -0.00019515296 + 0.008332161) * fVar107 + -0.16666655) + fVar102;
          auVar120._8_4_ =
               fVar108 * fVar103 *
               ((fVar108 * -0.00019515296 + 0.008332161) * fVar108 + -0.16666655) + fVar103;
          auVar120._12_4_ =
               fVar162 * fVar105 *
               ((fVar162 * -0.00019515296 + 0.008332161) * fVar162 + -0.16666655) + fVar105;
          auVar142 = vpand_avx(auVar293,auVar205);
          auVar142 = vpcmpeqd_avx(auVar142,_DAT_00552030);
          auVar185._0_4_ =
               (((fVar106 * 2.4433157e-05 + -0.0013887316) * fVar106 + 0.041666646) * fVar106 + -0.5
               ) * fVar106 + 1.0;
          auVar185._4_4_ =
               (((fVar107 * 2.4433157e-05 + -0.0013887316) * fVar107 + 0.041666646) * fVar107 + -0.5
               ) * fVar107 + 1.0;
          auVar185._8_4_ =
               (((fVar108 * 2.4433157e-05 + -0.0013887316) * fVar108 + 0.041666646) * fVar108 + -0.5
               ) * fVar108 + 1.0;
          auVar185._12_4_ =
               (((fVar162 * 2.4433157e-05 + -0.0013887316) * fVar162 + 0.041666646) * fVar162 + -0.5
               ) * fVar162 + 1.0;
          auVar142 = vblendvps_avx(auVar185,auVar120,auVar142);
          auVar131 = vpslld_avx(auVar205,0x1d);
          auVar148._8_4_ = 0x80000000;
          auVar148._0_8_ = 0x8000000080000000;
          auVar148._12_4_ = 0x80000000;
          auVar131 = vpand_avx(auVar131 ^ *(undefined1 (*) [16])pfVar20,auVar148);
          *(undefined1 (*) [16])pfVar20 = auVar131 ^ auVar142;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar16;
          auVar111 = vpshufd_avx(auVar32,0x44);
          local_c0._16_16_ = auVar111;
          local_c0._0_16_ = auVar111;
          local_d0 = vpor_avx(auVar111,local_f0);
          local_e0 = vpor_avx(auVar111,local_f0);
          uVar25 = 0;
          auVar134 = _DAT_00555120;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar25;
            auVar111 = vpshufd_avx(auVar33,0x44);
            auVar52._16_16_ = auVar111;
            auVar52._0_16_ = auVar111;
            auVar58 = vorps_avx(auVar52,_DAT_00555100);
            auVar134 = vorps_avx(auVar52,auVar134);
            auVar131 = vpor_avx(local_c0._16_16_,local_f0);
            auVar111 = vpcmpgtq_avx(auVar134._16_16_ ^ local_f0,auVar131);
            auVar142 = vpcmpgtq_avx(auVar134._0_16_ ^ local_f0,local_d0);
            auVar111 = vpackssdw_avx(auVar142,auVar111);
            auVar205 = in_ZMM8._0_16_;
            auVar142 = vpcmpgtq_avx(auVar58._16_16_ ^ local_f0,auVar131);
            auVar121._0_4_ = auVar58._0_4_ ^ local_f0._0_4_;
            auVar121._4_4_ = auVar58._4_4_ ^ local_f0._4_4_;
            auVar121._8_4_ = auVar58._8_4_ ^ local_f0._8_4_;
            auVar121._12_4_ = auVar58._12_4_ ^ local_f0._12_4_;
            auVar131 = vpcmpgtq_avx(auVar121,local_e0);
            auVar142 = vpackssdw_avx(auVar131,auVar142);
            auVar111 = vpackssdw_avx(auVar205 ^ auVar142,auVar205 ^ auVar111);
            auVar142 = vpmovsxwd_avx(auVar111);
            auVar111 = vpunpckhwd_avx(auVar111,auVar111);
            local_a0._16_16_ = auVar111;
            local_a0._0_16_ = auVar142;
            local_120 = vmaskmovps_avx(local_a0,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = sinf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_01;
            local_160._8_4_ = extraout_XMM0_Dc_01;
            local_160._12_4_ = extraout_XMM0_Dd_01;
            auVar111 = vmovshdup_avx(local_150);
            auVar72._0_4_ = sinf(auVar111._0_4_);
            auVar72._4_60_ = extraout_var_05;
            local_160 = vinsertps_avx(local_160,auVar72._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_150,1);
            auVar73._0_4_ = sinf(auVar111._0_4_);
            auVar73._4_60_ = extraout_var_06;
            local_160 = vinsertps_avx(local_160,auVar73._0_16_,0x20);
            auVar111 = vpermilps_avx(local_150,0xff);
            auVar74._0_4_ = sinf(auVar111._0_4_);
            auVar74._4_60_ = extraout_var_07;
            local_150 = vinsertps_avx(local_160,auVar74._0_16_,0x30);
            local_160._0_4_ = sinf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_02;
            local_160._8_4_ = extraout_XMM0_Dc_02;
            local_160._12_4_ = extraout_XMM0_Dd_02;
            auVar111 = vmovshdup_avx(local_120._0_16_);
            auVar75._0_4_ = sinf(auVar111._0_4_);
            auVar75._4_60_ = extraout_var_08;
            local_160 = vinsertps_avx(local_160,auVar75._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_120._0_16_,1);
            auVar76._0_4_ = sinf(auVar111._0_4_);
            auVar76._4_60_ = extraout_var_09;
            local_160 = vinsertps_avx(local_160,auVar76._0_16_,0x20);
            auVar111 = vpermilps_avx(local_120._0_16_,0xff);
            auVar77._0_4_ = sinf(auVar111._0_4_);
            auVar134 = _DAT_00555120;
            auVar77._4_60_ = extraout_var_10;
            auVar111 = vpcmpeqd_avx(auVar205,auVar205);
            in_ZMM8 = ZEXT1664(auVar111);
            auVar111 = vinsertps_avx(local_160,auVar77._0_16_,0x30);
            auVar53._16_16_ = local_150;
            auVar53._0_16_ = auVar111;
            auVar58 = vmaskmovps_avx(local_a0,auVar53);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar58;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 10:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar111 = in_ZMM7._0_16_;
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar20;
            afVar49 = (__m256)local_80;
            UnaryOp_x86_avx_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_161,(__m256 *)local_80);
            auVar111 = in_ZMM7._0_16_;
            *(__m256 *)pfVar20 = afVar49;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        uVar18 = uVar15 | 3;
        auVar111 = vpcmpeqd_avx(auVar111,auVar111);
        in_ZMM7 = ZEXT1664(auVar111);
        auVar254._8_4_ = 0xfffffffe;
        auVar254._0_8_ = 0xfffffffefffffffe;
        auVar254._12_4_ = 0xfffffffe;
        auVar277._8_4_ = 2;
        auVar277._0_8_ = 0x200000002;
        auVar277._12_4_ = 2;
        auVar210._8_4_ = 0x80000000;
        auVar210._0_8_ = 0x8000000080000000;
        auVar210._12_4_ = 0x80000000;
        while ((int)uVar18 < iVar23) {
          auVar39._8_4_ = 0x7fffffff;
          auVar39._0_8_ = 0x7fffffff7fffffff;
          auVar39._12_4_ = 0x7fffffff;
          auVar142 = vandps_avx(auVar39,*(undefined1 (*) [16])pfVar20);
          auVar130._0_4_ = (int)(auVar142._0_4_ * 1.2732395);
          auVar130._4_4_ = (int)(auVar142._4_4_ * 1.2732395);
          auVar130._8_4_ = (int)(auVar142._8_4_ * 1.2732395);
          auVar130._12_4_ = (int)(auVar142._12_4_ * 1.2732395);
          auVar131 = vpsubd_avx(auVar130,auVar111);
          auVar205 = vpand_avx(auVar254,auVar131);
          auVar131 = vcvtdq2ps_avx(auVar205);
          fVar26 = auVar142._0_4_ + auVar131._0_4_ * -0.7853982;
          fVar102 = auVar142._4_4_ + auVar131._4_4_ * -0.7853982;
          fVar103 = auVar142._8_4_ + auVar131._8_4_ * -0.7853982;
          fVar105 = auVar142._12_4_ + auVar131._12_4_ * -0.7853982;
          fVar106 = fVar26 * fVar26;
          fVar107 = fVar102 * fVar102;
          fVar108 = fVar103 * fVar103;
          fVar162 = fVar105 * fVar105;
          auVar131 = vpaddd_avx(auVar254,auVar205);
          auVar40._0_4_ =
               fVar106 * fVar26 * ((fVar106 * -0.00019515296 + 0.008332161) * fVar106 + -0.16666655)
               + fVar26;
          auVar40._4_4_ =
               fVar107 * fVar102 *
               ((fVar107 * -0.00019515296 + 0.008332161) * fVar107 + -0.16666655) + fVar102;
          auVar40._8_4_ =
               fVar108 * fVar103 *
               ((fVar108 * -0.00019515296 + 0.008332161) * fVar108 + -0.16666655) + fVar103;
          auVar40._12_4_ =
               fVar162 * fVar105 *
               ((fVar162 * -0.00019515296 + 0.008332161) * fVar162 + -0.16666655) + fVar105;
          auVar142 = vpand_avx(auVar277,auVar131);
          auVar142 = vpcmpeqd_avx(auVar142,_DAT_00552030);
          auVar168._0_4_ =
               (((fVar106 * 2.4433157e-05 + -0.0013887316) * fVar106 + 0.041666646) * fVar106 + -0.5
               ) * fVar106 + 1.0;
          auVar168._4_4_ =
               (((fVar107 * 2.4433157e-05 + -0.0013887316) * fVar107 + 0.041666646) * fVar107 + -0.5
               ) * fVar107 + 1.0;
          auVar168._8_4_ =
               (((fVar108 * 2.4433157e-05 + -0.0013887316) * fVar108 + 0.041666646) * fVar108 + -0.5
               ) * fVar108 + 1.0;
          auVar168._12_4_ =
               (((fVar162 * 2.4433157e-05 + -0.0013887316) * fVar162 + 0.041666646) * fVar162 + -0.5
               ) * fVar162 + 1.0;
          auVar142 = vblendvps_avx(auVar168,auVar40,auVar142);
          auVar131 = vpslld_avx(auVar131,0x1d);
          auVar131 = vpand_avx(auVar131,auVar210);
          *(undefined1 (*) [16])pfVar20 = auVar131 ^ auVar210 ^ auVar142;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar16;
          auVar111 = vpshufd_avx(auVar41,0x44);
          local_c0._16_16_ = auVar111;
          local_c0._0_16_ = auVar111;
          local_d0 = vpor_avx(auVar111,local_f0);
          local_e0 = vpor_avx(auVar111,local_f0);
          uVar25 = 0;
          auVar134 = _DAT_00555120;
          do {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar25;
            auVar111 = vpshufd_avx(auVar42,0x44);
            auVar61._16_16_ = auVar111;
            auVar61._0_16_ = auVar111;
            auVar58 = vorps_avx(auVar61,_DAT_00555100);
            auVar134 = vorps_avx(auVar61,auVar134);
            auVar131 = vpor_avx(local_c0._16_16_,local_f0);
            auVar111 = vpcmpgtq_avx(auVar134._16_16_ ^ local_f0,auVar131);
            auVar142 = vpcmpgtq_avx(auVar134._0_16_ ^ local_f0,local_d0);
            auVar111 = vpackssdw_avx(auVar142,auVar111);
            auVar205 = in_ZMM7._0_16_;
            auVar142 = vpcmpgtq_avx(auVar58._16_16_ ^ local_f0,auVar131);
            auVar132._0_4_ = auVar58._0_4_ ^ local_f0._0_4_;
            auVar132._4_4_ = auVar58._4_4_ ^ local_f0._4_4_;
            auVar132._8_4_ = auVar58._8_4_ ^ local_f0._8_4_;
            auVar132._12_4_ = auVar58._12_4_ ^ local_f0._12_4_;
            auVar131 = vpcmpgtq_avx(auVar132,local_e0);
            auVar142 = vpackssdw_avx(auVar131,auVar142);
            auVar111 = vpackssdw_avx(auVar142 ^ auVar205,auVar111 ^ auVar205);
            auVar142 = vpmovsxwd_avx(auVar111);
            auVar111 = vpunpckhwd_avx(auVar111,auVar111);
            local_a0._16_16_ = auVar111;
            local_a0._0_16_ = auVar142;
            local_120 = vmaskmovps_avx(local_a0,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = cosf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_07;
            local_160._8_4_ = extraout_XMM0_Dc_07;
            local_160._12_4_ = extraout_XMM0_Dd_07;
            auVar111 = vmovshdup_avx(local_150);
            auVar90._0_4_ = cosf(auVar111._0_4_);
            auVar90._4_60_ = extraout_var_23;
            local_160 = vinsertps_avx(local_160,auVar90._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_150,1);
            auVar91._0_4_ = cosf(auVar111._0_4_);
            auVar91._4_60_ = extraout_var_24;
            local_160 = vinsertps_avx(local_160,auVar91._0_16_,0x20);
            auVar111 = vpermilps_avx(local_150,0xff);
            auVar92._0_4_ = cosf(auVar111._0_4_);
            auVar92._4_60_ = extraout_var_25;
            local_150 = vinsertps_avx(local_160,auVar92._0_16_,0x30);
            local_160._0_4_ = cosf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_08;
            local_160._8_4_ = extraout_XMM0_Dc_08;
            local_160._12_4_ = extraout_XMM0_Dd_08;
            auVar111 = vmovshdup_avx(local_120._0_16_);
            auVar93._0_4_ = cosf(auVar111._0_4_);
            auVar93._4_60_ = extraout_var_26;
            local_160 = vinsertps_avx(local_160,auVar93._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_120._0_16_,1);
            auVar94._0_4_ = cosf(auVar111._0_4_);
            auVar94._4_60_ = extraout_var_27;
            local_160 = vinsertps_avx(local_160,auVar94._0_16_,0x20);
            auVar111 = vpermilps_avx(local_120._0_16_,0xff);
            auVar95._0_4_ = cosf(auVar111._0_4_);
            auVar134 = _DAT_00555120;
            auVar95._4_60_ = extraout_var_28;
            auVar111 = vpcmpeqd_avx(auVar205,auVar205);
            in_ZMM7 = ZEXT1664(auVar111);
            auVar111 = vinsertps_avx(local_160,auVar95._0_16_,0x30);
            auVar62._16_16_ = local_150;
            auVar62._0_16_ = auVar111;
            auVar58 = vmaskmovps_avx(local_a0,auVar62);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar58;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      local_138 = CONCAT44(local_138._4_4_,iVar23);
      do {
        pfVar20 = (float *)(local_128->cstep * local_130 * local_128->elemsize +
                           (long)local_128->data);
        iVar24 = (int)local_138;
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar20;
            afVar49 = (__m256)local_80;
            UnaryOp_x86_avx_functor::unary_op_tan::func_pack8(&local_161,(__m256 *)local_80);
            *(__m256 *)pfVar20 = afVar49;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar23 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar23 < iVar24);
        }
        auVar111 = in_ZMM5._0_16_;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar24) {
          local_80._0_16_ = *(undefined1 (*) [16])pfVar20;
          auVar104 = ZEXT856(*(ulong *)(pfVar20 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          afVar322 = UnaryOp_x86_avx_functor::unary_op_tan::func_pack4
                               (&local_161,(__m128 *)local_80);
          auVar111 = in_ZMM5._0_16_;
          auVar65._0_8_ = afVar322._0_8_;
          auVar65._8_56_ = auVar104;
          *(undefined1 (*) [16])pfVar20 = auVar65._0_16_;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar111 = vpcmpeqd_avx(auVar111,auVar111);
        in_ZMM5 = ZEXT1664(auVar111);
        if ((int)uVar15 < iVar24) {
          uVar16 = CONCAT44(0,~uVar15 + (int)local_138);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar16;
          auVar142 = vpshufd_avx(auVar30,0x44);
          auVar111 = vpor_avx(auVar142,local_f0);
          local_c0._0_16_ = auVar111;
          local_d0 = vpor_avx(auVar142,local_f0);
          local_e0 = vpor_avx(auVar142,local_f0);
          uVar25 = 0;
          auVar134 = _DAT_00555100;
          auVar58 = _DAT_00555120;
          do {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar25;
            auVar111 = vpshufd_avx(auVar31,0x44);
            auVar50._16_16_ = auVar111;
            auVar50._0_16_ = auVar111;
            auVar134 = vorps_avx(auVar50,auVar134);
            auVar58 = vorps_avx(auVar50,auVar58);
            auVar111 = vpcmpgtq_avx(auVar58._16_16_ ^ local_f0,local_c0._0_16_);
            auVar142 = vpcmpgtq_avx(auVar58._0_16_ ^ local_f0,local_d0);
            auVar111 = vpackssdw_avx(auVar142,auVar111);
            auVar205 = in_ZMM5._0_16_;
            auVar142 = vpcmpgtq_avx(auVar134._16_16_ ^ local_f0,local_c0._0_16_);
            auVar117._0_4_ = auVar134._0_4_ ^ local_f0._0_4_;
            auVar117._4_4_ = auVar134._4_4_ ^ local_f0._4_4_;
            auVar117._8_4_ = auVar134._8_4_ ^ local_f0._8_4_;
            auVar117._12_4_ = auVar134._12_4_ ^ local_f0._12_4_;
            auVar131 = vpcmpgtq_avx(auVar117,local_e0);
            auVar142 = vpackssdw_avx(auVar131,auVar142);
            auVar111 = vpackssdw_avx(auVar142 ^ auVar205,auVar111 ^ auVar205);
            auVar142 = vpmovsxwd_avx(auVar111);
            auVar111 = vpunpckhwd_avx(auVar111,auVar111);
            local_a0._16_16_ = auVar111;
            local_a0._0_16_ = auVar142;
            local_120 = vmaskmovps_avx(local_a0,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = tanf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db;
            local_160._8_4_ = extraout_XMM0_Dc;
            local_160._12_4_ = extraout_XMM0_Dd;
            auVar111 = vmovshdup_avx(local_150);
            auVar66._0_4_ = tanf(auVar111._0_4_);
            auVar66._4_60_ = extraout_var;
            local_160 = vinsertps_avx(local_160,auVar66._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_150,1);
            auVar67._0_4_ = tanf(auVar111._0_4_);
            auVar67._4_60_ = extraout_var_00;
            local_160 = vinsertps_avx(local_160,auVar67._0_16_,0x20);
            auVar111 = vpermilps_avx(local_150,0xff);
            auVar68._0_4_ = tanf(auVar111._0_4_);
            auVar68._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_160,auVar68._0_16_,0x30);
            local_160._0_4_ = tanf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_00;
            local_160._8_4_ = extraout_XMM0_Dc_00;
            local_160._12_4_ = extraout_XMM0_Dd_00;
            auVar111 = vmovshdup_avx(local_120._0_16_);
            auVar69._0_4_ = tanf(auVar111._0_4_);
            auVar69._4_60_ = extraout_var_02;
            local_160 = vinsertps_avx(local_160,auVar69._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_120._0_16_,1);
            auVar70._0_4_ = tanf(auVar111._0_4_);
            auVar70._4_60_ = extraout_var_03;
            local_160 = vinsertps_avx(local_160,auVar70._0_16_,0x20);
            auVar111 = vpermilps_avx(local_120._0_16_,0xff);
            auVar71._0_4_ = tanf(auVar111._0_4_);
            auVar58 = _DAT_00555120;
            auVar134 = _DAT_00555100;
            auVar71._4_60_ = extraout_var_04;
            auVar111 = vpcmpeqd_avx(auVar205,auVar205);
            in_ZMM5 = ZEXT1664(auVar111);
            auVar111 = vinsertps_avx(local_160,auVar71._0_16_,0x30);
            auVar51._16_16_ = local_150;
            auVar51._0_16_ = auVar111;
            auVar57 = vmaskmovps_avx(local_a0,auVar51);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_130 = local_130 + 1;
        iVar23 = (int)local_138;
      } while (local_130 != local_60);
    }
    break;
  case 0xc:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar301._8_4_ = 0x3f800000;
        auVar301._0_8_ = 0x3f8000003f800000;
        auVar282._8_4_ = 0x3f000000;
        auVar282._0_8_ = 0x3f0000003f000000;
        auVar257._8_4_ = 0x7fffffff;
        auVar257._0_8_ = 0x7fffffff7fffffff;
        auVar243._8_4_ = 0x80000000;
        auVar243._0_8_ = 0x8000000080000000;
        auVar301._12_4_ = 0x3f800000;
        auVar282._12_4_ = 0x3f000000;
        auVar257._12_4_ = 0x7fffffff;
        auVar243._12_4_ = 0x80000000;
        auVar301._16_4_ = 0x3f800000;
        auVar282._16_4_ = 0x3f000000;
        auVar257._16_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x80000000;
        auVar301._20_4_ = 0x3f800000;
        auVar282._20_4_ = 0x3f000000;
        auVar257._20_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x80000000;
        auVar301._24_4_ = 0x3f800000;
        auVar282._24_4_ = 0x3f000000;
        auVar257._24_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x80000000;
        auVar301._28_4_ = 0x3f800000;
        auVar282._28_4_ = 0x3f000000;
        auVar257._28_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x80000000;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar134 = vandps_avx(auVar257,*pauVar21);
            auVar161._0_4_ = auVar134._0_4_ * 0.5;
            auVar161._4_4_ = auVar134._4_4_ * 0.5;
            auVar161._8_4_ = auVar134._8_4_ * 0.5;
            auVar161._12_4_ = auVar134._12_4_ * 0.5;
            auVar161._16_4_ = auVar134._16_4_ * 0.5;
            auVar161._20_4_ = auVar134._20_4_ * 0.5;
            auVar161._28_36_ = in_ZMM2._28_36_;
            auVar161._24_4_ = auVar134._24_4_ * 0.5;
            auVar157 = vsubps_avx(auVar282,auVar161._0_32_);
            auVar58 = vrsqrtps_avx(auVar157);
            auVar57 = vcmpps_avx(auVar282,auVar134,1);
            fVar26 = auVar157._0_4_ * auVar58._0_4_;
            fVar102 = auVar157._4_4_ * auVar58._4_4_;
            fVar103 = auVar157._8_4_ * auVar58._8_4_;
            fVar105 = auVar157._12_4_ * auVar58._12_4_;
            fVar106 = auVar157._16_4_ * auVar58._16_4_;
            fVar107 = auVar157._20_4_ * auVar58._20_4_;
            fVar108 = auVar157._24_4_ * auVar58._24_4_;
            auVar5._4_4_ = fVar102 * -0.5 * (fVar102 * auVar58._4_4_ + -3.0);
            auVar5._0_4_ = fVar26 * -0.5 * (fVar26 * auVar58._0_4_ + -3.0);
            auVar5._8_4_ = fVar103 * -0.5 * (fVar103 * auVar58._8_4_ + -3.0);
            auVar5._12_4_ = fVar105 * -0.5 * (fVar105 * auVar58._12_4_ + -3.0);
            auVar5._16_4_ = fVar106 * -0.5 * (fVar106 * auVar58._16_4_ + -3.0);
            auVar5._20_4_ = fVar107 * -0.5 * (fVar107 * auVar58._20_4_ + -3.0);
            auVar5._24_4_ = fVar108 * -0.5 * (fVar108 * auVar58._24_4_ + -3.0);
            auVar5._28_4_ = auVar58._28_4_ + -3.0;
            auVar58 = vandps_avx(auVar257,auVar157);
            auVar212._8_4_ = 0x800000;
            auVar212._0_8_ = 0x80000000800000;
            auVar212._12_4_ = 0x800000;
            auVar212._16_4_ = 0x800000;
            auVar212._20_4_ = 0x800000;
            auVar212._24_4_ = 0x800000;
            auVar212._28_4_ = 0x800000;
            auVar58 = vcmpps_avx(auVar212,auVar58,2);
            auVar58 = vandps_avx(auVar58,auVar5);
            auVar58 = vblendvps_avx(auVar134,auVar58,auVar57);
            fVar26 = auVar58._0_4_;
            fVar162 = fVar26 * fVar26;
            fVar102 = auVar58._4_4_;
            fVar174 = fVar102 * fVar102;
            fVar103 = auVar58._8_4_;
            fVar176 = fVar103 * fVar103;
            fVar105 = auVar58._12_4_;
            fVar178 = fVar105 * fVar105;
            fVar106 = auVar58._16_4_;
            fVar197 = fVar106 * fVar106;
            fVar107 = auVar58._20_4_;
            fVar199 = fVar107 * fVar107;
            fVar108 = auVar58._24_4_;
            fVar201 = fVar108 * fVar108;
            fVar203 = fVar162 * fVar162;
            fVar214 = fVar174 * fVar174;
            fVar215 = fVar176 * fVar176;
            fVar216 = fVar178 * fVar178;
            fVar217 = fVar197 * fVar197;
            fVar218 = fVar199 * fVar199;
            fVar219 = fVar201 * fVar201;
            auVar134 = vandps_avx(auVar301,auVar57);
            fVar173 = auVar134._0_4_ * 1.5707964;
            fVar175 = auVar134._4_4_ * 1.5707964;
            fVar177 = auVar134._8_4_ * 1.5707964;
            fVar179 = auVar134._12_4_ * 1.5707964;
            fVar198 = auVar134._16_4_ * 1.5707964;
            fVar200 = auVar134._20_4_ * 1.5707964;
            fVar202 = auVar134._24_4_ * 1.5707964;
            in_ZMM2 = ZEXT3264(CONCAT428(0x3fc90fdb,
                                         CONCAT424(fVar202,CONCAT420(fVar200,CONCAT416(fVar198,
                                                  CONCAT412(fVar179,CONCAT48(fVar177,CONCAT44(
                                                  fVar175,fVar173))))))));
            auVar138._0_4_ =
                 (auVar134._0_4_ * -3.0 + 1.0) * fVar26 *
                 ((fVar203 * 0.023994016 + 0.07494697) * fVar203 + 1.0 +
                 ((fVar203 * 0.042417344 + 0.045520633) * fVar203 + 0.16666782) * fVar162) + fVar173
            ;
            auVar138._4_4_ =
                 (auVar134._4_4_ * -3.0 + 1.0) * fVar102 *
                 ((fVar214 * 0.023994016 + 0.07494697) * fVar214 + 1.0 +
                 ((fVar214 * 0.042417344 + 0.045520633) * fVar214 + 0.16666782) * fVar174) + fVar175
            ;
            auVar138._8_4_ =
                 (auVar134._8_4_ * -3.0 + 1.0) * fVar103 *
                 ((fVar215 * 0.023994016 + 0.07494697) * fVar215 + 1.0 +
                 ((fVar215 * 0.042417344 + 0.045520633) * fVar215 + 0.16666782) * fVar176) + fVar177
            ;
            auVar138._12_4_ =
                 (auVar134._12_4_ * -3.0 + 1.0) * fVar105 *
                 ((fVar216 * 0.023994016 + 0.07494697) * fVar216 + 1.0 +
                 ((fVar216 * 0.042417344 + 0.045520633) * fVar216 + 0.16666782) * fVar178) + fVar179
            ;
            auVar138._16_4_ =
                 (auVar134._16_4_ * -3.0 + 1.0) * fVar106 *
                 ((fVar217 * 0.023994016 + 0.07494697) * fVar217 + 1.0 +
                 ((fVar217 * 0.042417344 + 0.045520633) * fVar217 + 0.16666782) * fVar197) + fVar198
            ;
            auVar138._20_4_ =
                 (auVar134._20_4_ * -3.0 + 1.0) * fVar107 *
                 ((fVar218 * 0.023994016 + 0.07494697) * fVar218 + 1.0 +
                 ((fVar218 * 0.042417344 + 0.045520633) * fVar218 + 0.16666782) * fVar199) + fVar200
            ;
            auVar138._24_4_ =
                 (auVar134._24_4_ * -3.0 + 1.0) * fVar108 *
                 ((fVar219 * 0.023994016 + 0.07494697) * fVar219 + 1.0 +
                 ((fVar219 * 0.042417344 + 0.045520633) * fVar219 + 0.16666782) * fVar201) + fVar202
            ;
            auVar138._28_4_ = auVar58._28_4_ + 1.5707964;
            auVar134 = vandps_avx(auVar243,*pauVar21);
            auVar134 = vorps_avx(auVar134,auVar138);
            *pauVar21 = auVar134;
            pauVar21 = pauVar21 + 1;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar250._8_4_ = 0x7fffffff;
        auVar250._0_8_ = 0x7fffffff7fffffff;
        auVar250._12_4_ = 0x7fffffff;
        auVar265._8_4_ = 0x3f000000;
        auVar265._0_8_ = 0x3f0000003f000000;
        auVar265._12_4_ = 0x3f000000;
        auVar292._8_4_ = 0x3f800000;
        auVar292._0_8_ = 0x3f8000003f800000;
        auVar292._12_4_ = 0x3f800000;
        auVar314._8_4_ = 0x800000;
        auVar314._0_8_ = 0x80000000800000;
        auVar314._12_4_ = 0x800000;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar111 = vandps_avx(auVar250,*(undefined1 (*) [16])*pauVar21);
          auVar131 = vcmpps_avx(auVar265,auVar111,1);
          auVar165._0_4_ = auVar111._0_4_ * 0.5;
          auVar165._4_4_ = auVar111._4_4_ * 0.5;
          auVar165._8_4_ = auVar111._8_4_ * 0.5;
          auVar165._12_4_ = auVar111._12_4_ * 0.5;
          auVar205 = vsubps_avx(auVar265,auVar165);
          auVar142 = vrsqrtps_avx(auVar205);
          fVar26 = auVar205._0_4_ * auVar142._0_4_;
          fVar102 = auVar205._4_4_ * auVar142._4_4_;
          fVar103 = auVar205._8_4_ * auVar142._8_4_;
          fVar105 = auVar205._12_4_ * auVar142._12_4_;
          auVar184._0_4_ = fVar26 * -0.5 * (fVar26 * auVar142._0_4_ + -3.0);
          auVar184._4_4_ = fVar102 * -0.5 * (fVar102 * auVar142._4_4_ + -3.0);
          auVar184._8_4_ = fVar103 * -0.5 * (fVar103 * auVar142._8_4_ + -3.0);
          auVar184._12_4_ = fVar105 * -0.5 * (fVar105 * auVar142._12_4_ + -3.0);
          auVar142 = vandps_avx(auVar250,auVar205);
          auVar142 = vcmpps_avx(auVar314,auVar142,2);
          auVar142 = vandps_avx(auVar142,auVar184);
          auVar111 = vblendvps_avx(auVar111,auVar142,auVar131);
          fVar26 = auVar111._0_4_;
          fVar106 = fVar26 * fVar26;
          fVar102 = auVar111._4_4_;
          fVar107 = fVar102 * fVar102;
          fVar103 = auVar111._8_4_;
          fVar108 = fVar103 * fVar103;
          fVar105 = auVar111._12_4_;
          fVar162 = fVar105 * fVar105;
          fVar173 = fVar106 * fVar106;
          fVar174 = fVar107 * fVar107;
          fVar175 = fVar108 * fVar108;
          fVar176 = fVar162 * fVar162;
          auVar111 = vandps_avx(auVar292,auVar131);
          auVar118._0_4_ =
               (auVar111._0_4_ * -3.0 + 1.0) * fVar26 *
               ((fVar173 * 0.023994016 + 0.07494697) * fVar173 + 1.0 +
               ((fVar173 * 0.042417344 + 0.045520633) * fVar173 + 0.16666782) * fVar106) +
               auVar111._0_4_ * 1.5707964;
          auVar118._4_4_ =
               (auVar111._4_4_ * -3.0 + 1.0) * fVar102 *
               ((fVar174 * 0.023994016 + 0.07494697) * fVar174 + 1.0 +
               ((fVar174 * 0.042417344 + 0.045520633) * fVar174 + 0.16666782) * fVar107) +
               auVar111._4_4_ * 1.5707964;
          auVar118._8_4_ =
               (auVar111._8_4_ * -3.0 + 1.0) * fVar103 *
               ((fVar175 * 0.023994016 + 0.07494697) * fVar175 + 1.0 +
               ((fVar175 * 0.042417344 + 0.045520633) * fVar175 + 0.16666782) * fVar108) +
               auVar111._8_4_ * 1.5707964;
          auVar118._12_4_ =
               (auVar111._12_4_ * -3.0 + 1.0) * fVar105 *
               ((fVar176 * 0.023994016 + 0.07494697) * fVar176 + 1.0 +
               ((fVar176 * 0.042417344 + 0.045520633) * fVar176 + 0.16666782) * fVar162) +
               auVar111._12_4_ * 1.5707964;
          auVar146._8_4_ = 0x80000000;
          auVar146._0_8_ = 0x8000000080000000;
          auVar146._12_4_ = 0x80000000;
          in_ZMM2 = ZEXT1664(auVar146);
          auVar111 = vandps_avx(*(undefined1 (*) [16])*pauVar21,auVar146);
          auVar111 = vorps_avx(auVar111,auVar118);
          *(undefined1 (*) [16])*pauVar21 = auVar111;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            fVar26 = asinf(*(float *)(*pauVar21 + lVar19 * 4));
            *(float *)(*pauVar21 + lVar19 * 4) = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xd:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar287._8_4_ = 0x3f000000;
        auVar287._0_8_ = 0x3f0000003f000000;
        auVar259._8_4_ = 0x7fffffff;
        auVar259._0_8_ = 0x7fffffff7fffffff;
        auVar248._8_4_ = 0x80000000;
        auVar248._0_8_ = 0x8000000080000000;
        auVar141._8_4_ = 0x3d2dbdcf;
        auVar141._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar59._8_4_ = 0x800000;
        auVar59._0_8_ = 0x80000000800000;
        auVar287._12_4_ = 0x3f000000;
        auVar259._12_4_ = 0x7fffffff;
        auVar248._12_4_ = 0x80000000;
        auVar141._12_4_ = 0x3d2dbdcf;
        auVar59._12_4_ = 0x800000;
        auVar287._16_4_ = 0x3f000000;
        auVar259._16_4_ = 0x7fffffff;
        auVar248._16_4_ = 0x80000000;
        auVar141._16_4_ = 0x3d2dbdcf;
        auVar59._16_4_ = 0x800000;
        auVar287._20_4_ = 0x3f000000;
        auVar259._20_4_ = 0x7fffffff;
        auVar248._20_4_ = 0x80000000;
        auVar141._20_4_ = 0x3d2dbdcf;
        auVar59._20_4_ = 0x800000;
        auVar287._24_4_ = 0x3f000000;
        auVar259._24_4_ = 0x7fffffff;
        auVar248._24_4_ = 0x80000000;
        auVar141._24_4_ = 0x3d2dbdcf;
        auVar59._24_4_ = 0x800000;
        auVar287._28_4_ = 0x3f000000;
        auVar259._28_4_ = 0x7fffffff;
        auVar248._28_4_ = 0x80000000;
        auVar141._28_4_ = 0x3d2dbdcf;
        auVar59._28_4_ = 0x800000;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar134 = *pauVar21;
            auVar58 = vandps_avx(auVar259,auVar134);
            auVar14._4_4_ = auVar58._4_4_ * 0.5;
            auVar14._0_4_ = auVar58._0_4_ * 0.5;
            auVar14._8_4_ = auVar58._8_4_ * 0.5;
            auVar14._12_4_ = auVar58._12_4_ * 0.5;
            auVar14._16_4_ = auVar58._16_4_ * 0.5;
            auVar14._20_4_ = auVar58._20_4_ * 0.5;
            auVar14._24_4_ = auVar58._24_4_ * 0.5;
            auVar14._28_4_ = auVar141._28_4_;
            auVar157 = vsubps_avx(auVar287,auVar14);
            auVar57 = vrsqrtps_avx(auVar157);
            auVar141 = vcmpps_avx(auVar287,auVar58,1);
            fVar26 = auVar157._0_4_ * auVar57._0_4_;
            fVar102 = auVar157._4_4_ * auVar57._4_4_;
            fVar103 = auVar157._8_4_ * auVar57._8_4_;
            fVar105 = auVar157._12_4_ * auVar57._12_4_;
            fVar106 = auVar157._16_4_ * auVar57._16_4_;
            fVar107 = auVar157._20_4_ * auVar57._20_4_;
            fVar108 = auVar157._24_4_ * auVar57._24_4_;
            auVar10._4_4_ = fVar102 * -0.5 * (fVar102 * auVar57._4_4_ + -3.0);
            auVar10._0_4_ = fVar26 * -0.5 * (fVar26 * auVar57._0_4_ + -3.0);
            auVar10._8_4_ = fVar103 * -0.5 * (fVar103 * auVar57._8_4_ + -3.0);
            auVar10._12_4_ = fVar105 * -0.5 * (fVar105 * auVar57._12_4_ + -3.0);
            auVar10._16_4_ = fVar106 * -0.5 * (fVar106 * auVar57._16_4_ + -3.0);
            auVar10._20_4_ = fVar107 * -0.5 * (fVar107 * auVar57._20_4_ + -3.0);
            auVar10._24_4_ = fVar108 * -0.5 * (fVar108 * auVar57._24_4_ + -3.0);
            auVar10._28_4_ = auVar57._28_4_ + -3.0;
            auVar57 = vandps_avx(auVar259,auVar157);
            auVar57 = vcmpps_avx(auVar59,auVar57,2);
            auVar57 = vandps_avx(auVar57,auVar10);
            auVar57 = vblendvps_avx(auVar58,auVar57,auVar141);
            fVar26 = auVar57._0_4_;
            fVar162 = fVar26 * fVar26;
            fVar102 = auVar57._4_4_;
            fVar173 = fVar102 * fVar102;
            fVar103 = auVar57._8_4_;
            fVar174 = fVar103 * fVar103;
            fVar105 = auVar57._12_4_;
            fVar175 = fVar105 * fVar105;
            fVar106 = auVar57._16_4_;
            fVar176 = fVar106 * fVar106;
            fVar107 = auVar57._20_4_;
            fVar177 = fVar107 * fVar107;
            fVar108 = auVar57._24_4_;
            fVar178 = fVar108 * fVar108;
            fVar179 = fVar162 * fVar162;
            fVar197 = fVar173 * fVar173;
            fVar198 = fVar174 * fVar174;
            fVar199 = fVar175 * fVar175;
            fVar200 = fVar176 * fVar176;
            fVar201 = fVar177 * fVar177;
            fVar202 = fVar178 * fVar178;
            auVar58 = vandps_avx(auVar248,auVar134);
            fVar26 = ((fVar179 * 0.023994016 + 0.07494697) * fVar179 + 1.0 +
                     ((fVar179 * 0.042417344 + 0.045520633) * fVar179 + 0.16666782) * fVar162) *
                     fVar26;
            fVar102 = ((fVar197 * 0.023994016 + 0.07494697) * fVar197 + 1.0 +
                      ((fVar197 * 0.042417344 + 0.045520633) * fVar197 + 0.16666782) * fVar173) *
                      fVar102;
            auVar11._4_4_ = fVar102;
            auVar11._0_4_ = fVar26;
            fVar103 = ((fVar198 * 0.023994016 + 0.07494697) * fVar198 + 1.0 +
                      ((fVar198 * 0.042417344 + 0.045520633) * fVar198 + 0.16666782) * fVar174) *
                      fVar103;
            auVar11._8_4_ = fVar103;
            fVar105 = ((fVar199 * 0.023994016 + 0.07494697) * fVar199 + 1.0 +
                      ((fVar199 * 0.042417344 + 0.045520633) * fVar199 + 0.16666782) * fVar175) *
                      fVar105;
            auVar11._12_4_ = fVar105;
            fVar106 = ((fVar200 * 0.023994016 + 0.07494697) * fVar200 + 1.0 +
                      ((fVar200 * 0.042417344 + 0.045520633) * fVar200 + 0.16666782) * fVar176) *
                      fVar106;
            auVar11._16_4_ = fVar106;
            fVar107 = ((fVar201 * 0.023994016 + 0.07494697) * fVar201 + 1.0 +
                      ((fVar201 * 0.042417344 + 0.045520633) * fVar201 + 0.16666782) * fVar177) *
                      fVar107;
            auVar11._20_4_ = fVar107;
            fVar162 = auVar57._28_4_;
            fVar108 = ((fVar202 * 0.023994016 + 0.07494697) * fVar202 + 1.0 +
                      ((fVar202 * 0.042417344 + 0.045520633) * fVar202 + 0.16666782) * fVar178) *
                      fVar108;
            auVar11._24_4_ = fVar108;
            auVar11._28_4_ = fVar162;
            auVar57 = vorps_avx(auVar58,auVar11);
            auVar159._0_4_ = fVar26 + fVar26;
            auVar159._4_4_ = fVar102 + fVar102;
            auVar159._8_4_ = fVar103 + fVar103;
            auVar159._12_4_ = fVar105 + fVar105;
            auVar159._16_4_ = fVar106 + fVar106;
            auVar159._20_4_ = fVar107 + fVar107;
            auVar159._24_4_ = fVar108 + fVar108;
            auVar159._28_4_ = fVar162 + fVar162;
            auVar58 = vorps_avx(auVar58,auVar159);
            auVar134 = vcmpps_avx(auVar134,ZEXT1232(ZEXT812(0)) << 0x20,1);
            auVar196._8_4_ = 0x40490fdb;
            auVar196._0_8_ = 0x40490fdb40490fdb;
            auVar196._12_4_ = 0x40490fdb;
            auVar196._16_4_ = 0x40490fdb;
            auVar196._20_4_ = 0x40490fdb;
            auVar196._24_4_ = 0x40490fdb;
            auVar196._28_4_ = 0x40490fdb;
            auVar134 = vandps_avx(auVar134,auVar196);
            auVar60._0_4_ = auVar134._0_4_ + auVar58._0_4_;
            auVar60._4_4_ = auVar134._4_4_ + auVar58._4_4_;
            auVar60._8_4_ = auVar134._8_4_ + auVar58._8_4_;
            auVar60._12_4_ = auVar134._12_4_ + auVar58._12_4_;
            auVar60._16_4_ = auVar134._16_4_ + auVar58._16_4_;
            auVar60._20_4_ = auVar134._20_4_ + auVar58._20_4_;
            auVar60._24_4_ = auVar134._24_4_ + auVar58._24_4_;
            auVar60._28_4_ = auVar134._28_4_ + auVar58._28_4_;
            auVar160._8_4_ = 0x3fc90fdb;
            auVar160._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar160._12_4_ = 0x3fc90fdb;
            auVar160._16_4_ = 0x3fc90fdb;
            auVar160._20_4_ = 0x3fc90fdb;
            auVar160._24_4_ = 0x3fc90fdb;
            auVar160._28_4_ = 0x3fc90fdb;
            auVar134 = vsubps_avx(auVar160,auVar57);
            auVar134 = vblendvps_avx(auVar134,auVar60,auVar141);
            *pauVar21 = auVar134;
            pauVar21 = pauVar21 + 1;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar253._8_4_ = 0x7fffffff;
        auVar253._0_8_ = 0x7fffffff7fffffff;
        auVar253._12_4_ = 0x7fffffff;
        auVar274._8_4_ = 0x3f000000;
        auVar274._0_8_ = 0x3f0000003f000000;
        auVar274._12_4_ = 0x3f000000;
        auVar298._8_4_ = 0x3fc90fdb;
        auVar298._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar298._12_4_ = 0x3fc90fdb;
        auVar313._8_4_ = 0x40490fdb;
        auVar313._0_8_ = 0x40490fdb40490fdb;
        auVar313._12_4_ = 0x40490fdb;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar111 = *(undefined1 (*) [16])*pauVar21;
          auVar142 = vandps_avx(auVar253,auVar111);
          auVar205 = vcmpps_avx(auVar274,auVar142,1);
          auVar167._0_4_ = auVar142._0_4_ * 0.5;
          auVar167._4_4_ = auVar142._4_4_ * 0.5;
          auVar167._8_4_ = auVar142._8_4_ * 0.5;
          auVar167._12_4_ = auVar142._12_4_ * 0.5;
          auVar296 = vsubps_avx(auVar274,auVar167);
          auVar131 = vrsqrtps_avx(auVar296);
          fVar26 = auVar296._0_4_ * auVar131._0_4_;
          fVar102 = auVar296._4_4_ * auVar131._4_4_;
          fVar103 = auVar296._8_4_ * auVar131._8_4_;
          fVar105 = auVar296._12_4_ * auVar131._12_4_;
          auVar192._0_4_ = fVar26 * -0.5 * (fVar26 * auVar131._0_4_ + -3.0);
          auVar192._4_4_ = fVar102 * -0.5 * (fVar102 * auVar131._4_4_ + -3.0);
          auVar192._8_4_ = fVar103 * -0.5 * (fVar103 * auVar131._8_4_ + -3.0);
          auVar192._12_4_ = fVar105 * -0.5 * (fVar105 * auVar131._12_4_ + -3.0);
          auVar131 = vandps_avx(auVar253,auVar296);
          auVar209._8_4_ = 0x800000;
          auVar209._0_8_ = 0x80000000800000;
          auVar209._12_4_ = 0x800000;
          auVar131 = vcmpps_avx(auVar209,auVar131,2);
          auVar131 = vandps_avx(auVar131,auVar192);
          auVar142 = vblendvps_avx(auVar142,auVar131,auVar205);
          fVar26 = auVar142._0_4_;
          fVar106 = fVar26 * fVar26;
          fVar102 = auVar142._4_4_;
          fVar107 = fVar102 * fVar102;
          fVar103 = auVar142._8_4_;
          fVar108 = fVar103 * fVar103;
          fVar105 = auVar142._12_4_;
          fVar162 = fVar105 * fVar105;
          fVar173 = fVar106 * fVar106;
          fVar174 = fVar107 * fVar107;
          fVar175 = fVar108 * fVar108;
          fVar176 = fVar162 * fVar162;
          auVar193._8_4_ = 0x80000000;
          auVar193._0_8_ = 0x8000000080000000;
          auVar193._12_4_ = 0x80000000;
          auVar142 = vandps_avx(auVar111,auVar193);
          auVar153._0_4_ =
               ((fVar173 * 0.023994016 + 0.07494697) * fVar173 + 1.0 +
               ((fVar173 * 0.042417344 + 0.045520633) * fVar173 + 0.16666782) * fVar106) * fVar26;
          auVar153._4_4_ =
               ((fVar174 * 0.023994016 + 0.07494697) * fVar174 + 1.0 +
               ((fVar174 * 0.042417344 + 0.045520633) * fVar174 + 0.16666782) * fVar107) * fVar102;
          auVar153._8_4_ =
               ((fVar175 * 0.023994016 + 0.07494697) * fVar175 + 1.0 +
               ((fVar175 * 0.042417344 + 0.045520633) * fVar175 + 0.16666782) * fVar108) * fVar103;
          auVar153._12_4_ =
               ((fVar176 * 0.023994016 + 0.07494697) * fVar176 + 1.0 +
               ((fVar176 * 0.042417344 + 0.045520633) * fVar176 + 0.16666782) * fVar162) * fVar105;
          auVar131 = vorps_avx(auVar142,auVar153);
          auVar154._0_4_ = auVar153._0_4_ + auVar153._0_4_;
          auVar154._4_4_ = auVar153._4_4_ + auVar153._4_4_;
          auVar154._8_4_ = auVar153._8_4_ + auVar153._8_4_;
          auVar154._12_4_ = auVar153._12_4_ + auVar153._12_4_;
          auVar142 = vorps_avx(auVar142,auVar154);
          auVar111 = vcmpps_avx(auVar111,ZEXT816(0) << 0x20,1);
          auVar111 = vandps_avx(auVar313,auVar111);
          auVar129._0_4_ = auVar111._0_4_ + auVar142._0_4_;
          auVar129._4_4_ = auVar111._4_4_ + auVar142._4_4_;
          auVar129._8_4_ = auVar111._8_4_ + auVar142._8_4_;
          auVar129._12_4_ = auVar111._12_4_ + auVar142._12_4_;
          auVar111 = vsubps_avx(auVar298,auVar131);
          auVar111 = vblendvps_avx(auVar111,auVar129,auVar205);
          *(undefined1 (*) [16])*pauVar21 = auVar111;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            fVar26 = acosf(*(float *)(*pauVar21 + lVar19 * 4));
            *(float *)(*pauVar21 + lVar19 * 4) = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xe:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar281._8_4_ = 0x3f800000;
        auVar281._0_8_ = 0x3f8000003f800000;
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar240._8_4_ = 0x80000000;
        auVar240._0_8_ = 0x8000000080000000;
        auVar170._8_4_ = 0xbf800000;
        auVar170._0_8_ = 0xbf800000bf800000;
        auVar281._12_4_ = 0x3f800000;
        auVar256._12_4_ = 0x7fffffff;
        auVar240._12_4_ = 0x80000000;
        auVar170._12_4_ = 0xbf800000;
        auVar281._16_4_ = 0x3f800000;
        auVar256._16_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x80000000;
        auVar170._16_4_ = 0xbf800000;
        auVar281._20_4_ = 0x3f800000;
        auVar256._20_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x80000000;
        auVar170._20_4_ = 0xbf800000;
        auVar281._24_4_ = 0x3f800000;
        auVar256._24_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x80000000;
        auVar170._24_4_ = 0xbf800000;
        auVar281._28_4_ = 0x3f800000;
        auVar256._28_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x80000000;
        auVar170._28_4_ = 0xbf800000;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar134 = vandps_avx(auVar256,*pauVar21);
            auVar57 = vcmpps_avx(auVar281,auVar134,1);
            auVar58 = vblendvps_avx(auVar134,auVar170,auVar57);
            auVar134 = vmaxps_avx(auVar281,auVar134);
            auVar157 = vrcpps_avx(auVar134);
            fVar26 = auVar58._0_4_ * auVar157._0_4_;
            fVar102 = auVar58._4_4_ * auVar157._4_4_;
            fVar103 = auVar58._8_4_ * auVar157._8_4_;
            fVar105 = auVar58._12_4_ * auVar157._12_4_;
            fVar106 = auVar58._16_4_ * auVar157._16_4_;
            fVar107 = auVar58._20_4_ * auVar157._20_4_;
            fVar108 = auVar58._24_4_ * auVar157._24_4_;
            auVar2._4_4_ = auVar134._4_4_ * fVar102;
            auVar2._0_4_ = auVar134._0_4_ * fVar26;
            auVar2._8_4_ = auVar134._8_4_ * fVar103;
            auVar2._12_4_ = auVar134._12_4_ * fVar105;
            auVar2._16_4_ = auVar134._16_4_ * fVar106;
            auVar2._20_4_ = auVar134._20_4_ * fVar107;
            auVar2._24_4_ = auVar134._24_4_ * fVar108;
            auVar2._28_4_ = auVar134._28_4_;
            auVar58 = vsubps_avx(auVar58,auVar2);
            fVar26 = fVar26 + auVar157._0_4_ * auVar58._0_4_;
            fVar102 = fVar102 + auVar157._4_4_ * auVar58._4_4_;
            fVar103 = fVar103 + auVar157._8_4_ * auVar58._8_4_;
            fVar105 = fVar105 + auVar157._12_4_ * auVar58._12_4_;
            fVar106 = fVar106 + auVar157._16_4_ * auVar58._16_4_;
            fVar107 = fVar107 + auVar157._20_4_ * auVar58._20_4_;
            fVar108 = fVar108 + auVar157._24_4_ * auVar58._24_4_;
            fVar220 = in_ZMM5._28_4_;
            fVar162 = fVar26 * fVar26;
            fVar173 = fVar102 * fVar102;
            fVar174 = fVar103 * fVar103;
            fVar175 = fVar105 * fVar105;
            fVar176 = fVar106 * fVar106;
            fVar177 = fVar107 * fVar107;
            fVar178 = fVar108 * fVar108;
            fVar179 = fVar162 * fVar162;
            fVar197 = fVar173 * fVar173;
            fVar198 = fVar174 * fVar174;
            fVar199 = fVar175 * fVar175;
            fVar200 = fVar176 * fVar176;
            fVar201 = fVar177 * fVar177;
            fVar202 = fVar178 * fVar178;
            fVar203 = ((fVar179 * -0.01606863 + -0.07504295) * fVar179 + -0.14203644) * fVar179 +
                      -0.33333072;
            fVar214 = ((fVar197 * -0.01606863 + -0.07504295) * fVar197 + -0.14203644) * fVar197 +
                      -0.33333072;
            fVar215 = ((fVar198 * -0.01606863 + -0.07504295) * fVar198 + -0.14203644) * fVar198 +
                      -0.33333072;
            fVar216 = ((fVar199 * -0.01606863 + -0.07504295) * fVar199 + -0.14203644) * fVar199 +
                      -0.33333072;
            fVar217 = ((fVar200 * -0.01606863 + -0.07504295) * fVar200 + -0.14203644) * fVar200 +
                      -0.33333072;
            fVar218 = ((fVar201 * -0.01606863 + -0.07504295) * fVar201 + -0.14203644) * fVar201 +
                      -0.33333072;
            fVar219 = ((fVar202 * -0.01606863 + -0.07504295) * fVar202 + -0.14203644) * fVar202 +
                      -0.33333072;
            in_ZMM5 = ZEXT3264(CONCAT428(fVar220 + -0.07504295 + -0.14203644 + -0.33333072,
                                         CONCAT424(fVar219,CONCAT420(fVar218,CONCAT416(fVar217,
                                                  CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(
                                                  fVar214,fVar203))))))));
            auVar171._8_4_ = 0x3fc90fdb;
            auVar171._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar171._12_4_ = 0x3fc90fdb;
            auVar171._16_4_ = 0x3fc90fdb;
            auVar171._20_4_ = 0x3fc90fdb;
            auVar171._24_4_ = 0x3fc90fdb;
            auVar171._28_4_ = 0x3fc90fdb;
            auVar134 = vandps_avx(auVar57,auVar171);
            auVar137._0_4_ =
                 ((((fVar179 * 0.0028498897 + 0.04269152) * fVar179 + 0.10640934) * fVar179 +
                  0.1999262) * fVar179 + 1.0 + fVar203 * fVar162) * fVar26 + auVar134._0_4_;
            auVar137._4_4_ =
                 ((((fVar197 * 0.0028498897 + 0.04269152) * fVar197 + 0.10640934) * fVar197 +
                  0.1999262) * fVar197 + 1.0 + fVar214 * fVar173) * fVar102 + auVar134._4_4_;
            auVar137._8_4_ =
                 ((((fVar198 * 0.0028498897 + 0.04269152) * fVar198 + 0.10640934) * fVar198 +
                  0.1999262) * fVar198 + 1.0 + fVar215 * fVar174) * fVar103 + auVar134._8_4_;
            auVar137._12_4_ =
                 ((((fVar199 * 0.0028498897 + 0.04269152) * fVar199 + 0.10640934) * fVar199 +
                  0.1999262) * fVar199 + 1.0 + fVar216 * fVar175) * fVar105 + auVar134._12_4_;
            auVar137._16_4_ =
                 ((((fVar200 * 0.0028498897 + 0.04269152) * fVar200 + 0.10640934) * fVar200 +
                  0.1999262) * fVar200 + 1.0 + fVar217 * fVar176) * fVar106 + auVar134._16_4_;
            auVar137._20_4_ =
                 ((((fVar201 * 0.0028498897 + 0.04269152) * fVar201 + 0.10640934) * fVar201 +
                  0.1999262) * fVar201 + 1.0 + fVar218 * fVar177) * fVar107 + auVar134._20_4_;
            auVar137._24_4_ =
                 ((((fVar202 * 0.0028498897 + 0.04269152) * fVar202 + 0.10640934) * fVar202 +
                  0.1999262) * fVar202 + 1.0 + fVar219 * fVar178) * fVar108 + auVar134._24_4_;
            auVar137._28_4_ = fVar220 + auVar58._28_4_ + auVar134._28_4_;
            auVar134 = vandps_avx(auVar240,*pauVar21);
            auVar134 = vorps_avx(auVar134,auVar137);
            *pauVar21 = auVar134;
            pauVar21 = pauVar21 + 1;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar262._8_4_ = 0x3f800000;
        auVar262._0_8_ = 0x3f8000003f800000;
        auVar262._12_4_ = 0x3f800000;
        auVar291._8_4_ = 0xbf800000;
        auVar291._0_8_ = 0xbf800000bf800000;
        auVar291._12_4_ = 0xbf800000;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar114._8_4_ = 0x7fffffff;
          auVar114._0_8_ = 0x7fffffff7fffffff;
          auVar114._12_4_ = 0x7fffffff;
          auVar111 = vandps_avx(*(undefined1 (*) [16])*pauVar21,auVar114);
          auVar131 = vcmpps_avx(auVar262,auVar111,1);
          auVar142 = vblendvps_avx(auVar111,auVar291,auVar131);
          auVar111 = vmaxps_avx(auVar262,auVar111);
          auVar205 = vrcpps_avx(auVar111);
          fVar26 = auVar142._0_4_ * auVar205._0_4_;
          fVar102 = auVar142._4_4_ * auVar205._4_4_;
          fVar103 = auVar142._8_4_ * auVar205._8_4_;
          fVar105 = auVar142._12_4_ * auVar205._12_4_;
          auVar115._0_4_ = auVar111._0_4_ * fVar26;
          auVar115._4_4_ = auVar111._4_4_ * fVar102;
          auVar115._8_4_ = auVar111._8_4_ * fVar103;
          auVar115._12_4_ = auVar111._12_4_ * fVar105;
          auVar111 = vsubps_avx(auVar142,auVar115);
          fVar26 = fVar26 + auVar205._0_4_ * auVar111._0_4_;
          fVar102 = fVar102 + auVar205._4_4_ * auVar111._4_4_;
          fVar103 = fVar103 + auVar205._8_4_ * auVar111._8_4_;
          fVar105 = fVar105 + auVar205._12_4_ * auVar111._12_4_;
          fVar106 = fVar26 * fVar26;
          fVar107 = fVar102 * fVar102;
          fVar108 = fVar103 * fVar103;
          fVar162 = fVar105 * fVar105;
          fVar173 = fVar106 * fVar106;
          fVar174 = fVar107 * fVar107;
          fVar175 = fVar108 * fVar108;
          fVar176 = fVar162 * fVar162;
          fVar177 = ((fVar173 * -0.01606863 + -0.07504295) * fVar173 + -0.14203644) * fVar173 +
                    -0.33333072;
          fVar178 = ((fVar174 * -0.01606863 + -0.07504295) * fVar174 + -0.14203644) * fVar174 +
                    -0.33333072;
          fVar179 = ((fVar175 * -0.01606863 + -0.07504295) * fVar175 + -0.14203644) * fVar175 +
                    -0.33333072;
          fVar197 = ((fVar176 * -0.01606863 + -0.07504295) * fVar176 + -0.14203644) * fVar176 +
                    -0.33333072;
          in_ZMM5 = ZEXT1664(CONCAT412(fVar197,CONCAT48(fVar179,CONCAT44(fVar178,fVar177))));
          auVar164._8_4_ = 0x3fc90fdb;
          auVar164._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar164._12_4_ = 0x3fc90fdb;
          auVar111 = vandps_avx(auVar131,auVar164);
          auVar116._0_4_ =
               ((((fVar173 * 0.0028498897 + 0.04269152) * fVar173 + 0.10640934) * fVar173 +
                0.1999262) * fVar173 + 1.0 + fVar177 * fVar106) * fVar26 + auVar111._0_4_;
          auVar116._4_4_ =
               ((((fVar174 * 0.0028498897 + 0.04269152) * fVar174 + 0.10640934) * fVar174 +
                0.1999262) * fVar174 + 1.0 + fVar178 * fVar107) * fVar102 + auVar111._4_4_;
          auVar116._8_4_ =
               ((((fVar175 * 0.0028498897 + 0.04269152) * fVar175 + 0.10640934) * fVar175 +
                0.1999262) * fVar175 + 1.0 + fVar179 * fVar108) * fVar103 + auVar111._8_4_;
          auVar116._12_4_ =
               ((((fVar176 * 0.0028498897 + 0.04269152) * fVar176 + 0.10640934) * fVar176 +
                0.1999262) * fVar176 + 1.0 + fVar197 * fVar162) * fVar105 + auVar111._12_4_;
          auVar144._8_4_ = 0x80000000;
          auVar144._0_8_ = 0x8000000080000000;
          auVar144._12_4_ = 0x80000000;
          auVar111 = vandps_avx(*(undefined1 (*) [16])*pauVar21,auVar144);
          auVar111 = vorps_avx(auVar111,auVar116);
          *(undefined1 (*) [16])*pauVar21 = auVar111;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar26 = atanf(*(float *)(*pauVar21 + lVar19 * 4));
            *(float *)(*pauVar21 + lVar19 * 4) = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xf:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar54._8_4_ = 0x3f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar54._12_4_ = 0x3f800000;
      auVar54._16_4_ = 0x3f800000;
      auVar54._20_4_ = 0x3f800000;
      auVar54._24_4_ = 0x3f800000;
      auVar54._28_4_ = 0x3f800000;
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar187._8_8_ = 0x8000000000000000;
      auVar187._0_8_ = 0x8000000000000000;
      auVar111 = vpcmpeqd_avx(auVar142,auVar142);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar57 = *pauVar21;
            auVar157 = vrcpps_avx(auVar57);
            fVar26 = auVar157._0_4_;
            fVar102 = auVar157._4_4_;
            auVar6._4_4_ = auVar57._4_4_ * fVar102;
            auVar6._0_4_ = auVar57._0_4_ * fVar26;
            fVar103 = auVar157._8_4_;
            auVar6._8_4_ = auVar57._8_4_ * fVar103;
            fVar105 = auVar157._12_4_;
            auVar6._12_4_ = auVar57._12_4_ * fVar105;
            fVar106 = auVar157._16_4_;
            auVar6._16_4_ = auVar57._16_4_ * fVar106;
            fVar107 = auVar157._20_4_;
            auVar6._20_4_ = auVar57._20_4_ * fVar107;
            fVar108 = auVar157._24_4_;
            auVar6._24_4_ = auVar57._24_4_ * fVar108;
            auVar6._28_4_ = auVar57._28_4_;
            auVar57 = vsubps_avx(auVar54,auVar6);
            auVar230._0_4_ = fVar26 + fVar26 * auVar57._0_4_;
            auVar230._4_4_ = fVar102 + fVar102 * auVar57._4_4_;
            auVar230._8_4_ = fVar103 + fVar103 * auVar57._8_4_;
            auVar230._12_4_ = fVar105 + fVar105 * auVar57._12_4_;
            auVar230._16_4_ = fVar106 + fVar106 * auVar57._16_4_;
            auVar230._20_4_ = fVar107 + fVar107 * auVar57._20_4_;
            auVar230._24_4_ = fVar108 + fVar108 * auVar57._24_4_;
            auVar230._28_4_ = auVar157._28_4_ + auVar57._28_4_;
            *pauVar21 = auVar230;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar142 = *(undefined1 (*) [16])*pauVar21;
          auVar131 = vrcpps_avx(auVar142);
          fVar26 = auVar131._0_4_;
          auVar223._0_4_ = auVar142._0_4_ * fVar26;
          fVar102 = auVar131._4_4_;
          auVar223._4_4_ = auVar142._4_4_ * fVar102;
          fVar103 = auVar131._8_4_;
          auVar223._8_4_ = auVar142._8_4_ * fVar103;
          fVar105 = auVar131._12_4_;
          auVar223._12_4_ = auVar142._12_4_ * fVar105;
          auVar142 = vsubps_avx(auVar122,auVar223);
          auVar224._0_4_ = fVar26 + fVar26 * auVar142._0_4_;
          auVar224._4_4_ = fVar102 + fVar102 * auVar142._4_4_;
          auVar224._8_4_ = fVar103 + fVar103 * auVar142._8_4_;
          auVar224._12_4_ = fVar105 + fVar105 * auVar142._12_4_;
          *(undefined1 (*) [16])*pauVar21 = auVar224;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar225._8_8_ = 0;
          auVar225._0_8_ = uVar16;
          auVar205 = vpshufd_avx(auVar225,0x44);
          auVar142 = vorps_avx(auVar205,auVar187);
          auVar131 = vorps_avx(auVar205,auVar187);
          auVar205 = vorps_avx(auVar205,auVar187);
          uVar25 = 0;
          do {
            auVar268._8_8_ = 0;
            auVar268._0_8_ = uVar25;
            auVar296 = vpshufd_avx(auVar268,0x44);
            auVar283._16_16_ = auVar296;
            auVar283._0_16_ = auVar296;
            auVar57 = vorps_avx(auVar283,auVar134);
            auVar157 = vorps_avx(auVar283,auVar58);
            auVar306._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
            auVar306._8_4_ = auVar157._24_4_;
            auVar306._12_4_ = auVar157._28_4_ ^ 0x80000000;
            auVar296 = vpcmpgtq_avx(auVar306,auVar142);
            auVar269._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
            auVar269._8_4_ = auVar157._8_4_;
            auVar269._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar269,auVar131);
            auVar296 = vpackssdw_avx(auVar36,auVar296);
            auVar307._0_8_ = auVar57._16_8_ ^ 0x8000000000000000;
            auVar307._8_4_ = auVar57._24_4_;
            auVar307._12_4_ = auVar57._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar307,auVar142);
            auVar294._0_8_ = auVar57._0_8_ ^ 0x8000000000000000;
            auVar294._8_4_ = auVar57._8_4_;
            auVar294._12_4_ = auVar57._12_4_ ^ 0x80000000;
            auVar127 = vpcmpgtq_avx(auVar294,auVar205);
            auVar36 = vpackssdw_avx(auVar127,auVar36);
            auVar296 = vpackssdw_avx(auVar36 ^ auVar111,auVar296 ^ auVar111);
            auVar36 = vpmovsxwd_avx(auVar296);
            auVar296 = vpunpckhwd_avx(auVar296,auVar296);
            auVar284._16_16_ = auVar296;
            auVar284._0_16_ = auVar36;
            auVar157 = vmaskmovps_avx(auVar284,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar57 = vrcpps_avx(auVar157);
            fVar26 = auVar57._0_4_;
            fVar102 = auVar57._4_4_;
            auVar7._4_4_ = auVar157._4_4_ * fVar102;
            auVar7._0_4_ = auVar157._0_4_ * fVar26;
            fVar103 = auVar57._8_4_;
            auVar7._8_4_ = auVar157._8_4_ * fVar103;
            fVar105 = auVar57._12_4_;
            auVar7._12_4_ = auVar157._12_4_ * fVar105;
            fVar106 = auVar57._16_4_;
            auVar7._16_4_ = auVar157._16_4_ * fVar106;
            fVar107 = auVar57._20_4_;
            auVar7._20_4_ = auVar157._20_4_ * fVar107;
            fVar108 = auVar57._24_4_;
            auVar7._24_4_ = auVar157._24_4_ * fVar108;
            auVar7._28_4_ = auVar157._28_4_;
            auVar157 = vsubps_avx(auVar54,auVar7);
            auVar302._0_4_ = fVar26 + fVar26 * auVar157._0_4_;
            auVar302._4_4_ = fVar102 + fVar102 * auVar157._4_4_;
            auVar302._8_4_ = fVar103 + fVar103 * auVar157._8_4_;
            auVar302._12_4_ = fVar105 + fVar105 * auVar157._12_4_;
            auVar302._16_4_ = fVar106 + fVar106 * auVar157._16_4_;
            auVar302._20_4_ = fVar107 + fVar107 * auVar157._20_4_;
            auVar302._24_4_ = fVar108 + fVar108 * auVar157._24_4_;
            auVar302._28_4_ = auVar57._28_4_ + auVar157._28_4_;
            auVar57 = vmaskmovps_avx(auVar284,auVar302);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 0x10:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar280._8_4_ = 0x3f800000;
        auVar280._0_8_ = 0x3f8000003f800000;
        auVar157._8_4_ = 0xc2b0c0a5;
        auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar134._8_4_ = 0x42b0c0a5;
        auVar134._0_8_ = 0x42b0c0a542b0c0a5;
        auVar280._12_4_ = 0x3f800000;
        auVar157._12_4_ = 0xc2b0c0a5;
        auVar134._12_4_ = 0x42b0c0a5;
        auVar280._16_4_ = 0x3f800000;
        auVar157._16_4_ = 0xc2b0c0a5;
        auVar134._16_4_ = 0x42b0c0a5;
        auVar280._20_4_ = 0x3f800000;
        auVar157._20_4_ = 0xc2b0c0a5;
        auVar134._20_4_ = 0x42b0c0a5;
        auVar280._24_4_ = 0x3f800000;
        auVar157._24_4_ = 0xc2b0c0a5;
        auVar134._24_4_ = 0x42b0c0a5;
        auVar280._28_4_ = 0x3f800000;
        auVar157._28_4_ = 0xc2b0c0a5;
        auVar134._28_4_ = 0x42b0c0a5;
        pfVar20 = (float *)(local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data)
        ;
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar13._4_4_ = pfVar20[1] * -2.0;
            auVar13._0_4_ = *pfVar20 * -2.0;
            auVar13._8_4_ = pfVar20[2] * -2.0;
            auVar13._12_4_ = pfVar20[3] * -2.0;
            auVar13._16_4_ = pfVar20[4] * -2.0;
            auVar13._20_4_ = pfVar20[5] * -2.0;
            auVar13._24_4_ = pfVar20[6] * -2.0;
            auVar13._28_4_ = 0xc0000000;
            auVar58 = vminps_avx(auVar13,auVar134);
            auVar57 = vmaxps_avx(auVar58,auVar157);
            auVar135._0_4_ = auVar57._0_4_ * 1.442695 + 0.5;
            auVar135._4_4_ = auVar57._4_4_ * 1.442695 + 0.5;
            auVar135._8_4_ = auVar57._8_4_ * 1.442695 + 0.5;
            auVar135._12_4_ = auVar57._12_4_ * 1.442695 + 0.5;
            auVar135._16_4_ = auVar57._16_4_ * 1.442695 + 0.5;
            auVar135._20_4_ = auVar57._20_4_ * 1.442695 + 0.5;
            auVar135._24_4_ = auVar57._24_4_ * 1.442695 + 0.5;
            auVar135._28_4_ = 0x42b1c0a5;
            auVar1 = vroundps_avx(auVar135,1);
            auVar58 = vcmpps_avx(auVar135,auVar1,1);
            auVar58 = vandps_avx(auVar280,auVar58);
            auVar58 = vsubps_avx(auVar1,auVar58);
            fVar26 = auVar57._0_4_ + auVar58._0_4_ * -0.6931472;
            fVar102 = auVar57._4_4_ + auVar58._4_4_ * -0.6931472;
            fVar103 = auVar57._8_4_ + auVar58._8_4_ * -0.6931472;
            fVar105 = auVar57._12_4_ + auVar58._12_4_ * -0.6931472;
            fVar106 = auVar57._16_4_ + auVar58._16_4_ * -0.6931472;
            fVar107 = auVar57._20_4_ + auVar58._20_4_ * -0.6931472;
            fVar108 = auVar57._24_4_ + auVar58._24_4_ * -0.6931472;
            auVar110._0_4_ = (int)auVar58._0_4_;
            auVar110._4_4_ = (int)auVar58._4_4_;
            auVar110._8_4_ = (int)auVar58._8_4_;
            auVar110._12_4_ = (int)auVar58._12_4_;
            auVar136._16_4_ = (int)auVar58._16_4_;
            auVar136._0_16_ = auVar110;
            auVar136._20_4_ = (int)auVar58._20_4_;
            auVar136._24_4_ = (int)auVar58._24_4_;
            auVar136._28_4_ = (int)auVar58._28_4_;
            auVar142 = vpslld_avx(auVar110,0x17);
            auVar111 = vpslld_avx(auVar136._16_16_,0x17);
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = 0x3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar111 = vpaddd_avx(auVar111,auVar163);
            auVar142 = vpaddd_avx(auVar142,auVar163);
            auVar48._0_4_ =
                 (fVar26 + 1.0 +
                 fVar26 * fVar26 *
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar142._0_4_ + 1.0;
            auVar48._4_4_ =
                 (fVar102 + 1.0 +
                 fVar102 * fVar102 *
                 (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                   0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar142._4_4_ + 1.0;
            auVar48._8_4_ =
                 (fVar103 + 1.0 +
                 fVar103 * fVar103 *
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5)) * auVar142._8_4_ + 1.0;
            auVar48._12_4_ =
                 (fVar105 + 1.0 +
                 fVar105 * fVar105 *
                 (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                   0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar142._12_4_ + 1.0;
            auVar48._16_4_ =
                 (fVar106 + 1.0 +
                 fVar106 * fVar106 *
                 (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                   0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5)) * auVar111._0_4_ + 1.0;
            auVar48._20_4_ =
                 (fVar107 + 1.0 +
                 fVar107 * fVar107 *
                 (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                   0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar111._4_4_ + 1.0;
            auVar48._24_4_ =
                 (fVar108 + 1.0 +
                 fVar108 * fVar108 *
                 (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                   0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar111._8_4_ + 1.0;
            auVar48._28_4_ = auVar57._28_4_ + auVar1._28_4_ + 1.0 + auVar1._28_4_ + 1.0;
            auVar58 = vrcpps_avx(auVar48);
            fVar26 = auVar58._0_4_;
            fVar102 = auVar58._4_4_;
            fVar103 = auVar58._8_4_;
            fVar105 = auVar58._12_4_;
            fVar106 = auVar58._16_4_;
            fVar107 = auVar58._20_4_;
            fVar108 = auVar58._24_4_;
            auVar1._4_4_ = auVar48._4_4_ * (fVar102 + fVar102);
            auVar1._0_4_ = auVar48._0_4_ * (fVar26 + fVar26);
            auVar1._8_4_ = auVar48._8_4_ * (fVar103 + fVar103);
            auVar1._12_4_ = auVar48._12_4_ * (fVar105 + fVar105);
            auVar1._16_4_ = auVar48._16_4_ * (fVar106 + fVar106);
            auVar1._20_4_ = auVar48._20_4_ * (fVar107 + fVar107);
            auVar1._24_4_ = auVar48._24_4_ * (fVar108 + fVar108);
            auVar1._28_4_ = auVar48._28_4_;
            auVar169._8_4_ = 0x40000000;
            auVar169._0_8_ = 0x4000000040000000;
            auVar169._12_4_ = 0x40000000;
            auVar169._16_4_ = 0x40000000;
            auVar169._20_4_ = 0x40000000;
            auVar169._24_4_ = 0x40000000;
            auVar169._28_4_ = 0x40000000;
            auVar57 = vsubps_avx(auVar169,auVar1);
            *pfVar20 = fVar26 + fVar26 + -1.0 + fVar26 * auVar57._0_4_;
            pfVar20[1] = fVar102 + fVar102 + -1.0 + fVar102 * auVar57._4_4_;
            pfVar20[2] = fVar103 + fVar103 + -1.0 + fVar103 * auVar57._8_4_;
            pfVar20[3] = fVar105 + fVar105 + -1.0 + fVar105 * auVar57._12_4_;
            pfVar20[4] = fVar106 + fVar106 + -1.0 + fVar106 * auVar57._16_4_;
            pfVar20[5] = fVar107 + fVar107 + -1.0 + fVar107 * auVar57._20_4_;
            pfVar20[6] = fVar108 + fVar108 + -1.0 + fVar108 * auVar57._24_4_;
            pfVar20[7] = auVar58._28_4_ + auVar58._28_4_ + -1.0 + auVar57._28_4_;
            pfVar20 = pfVar20 + 8;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar181._8_4_ = 0x3f800000;
        auVar181._0_8_ = 0x3f8000003f800000;
        auVar181._12_4_ = 0x3f800000;
        auVar222._8_4_ = 0x42b0c0a5;
        auVar222._0_8_ = 0x42b0c0a542b0c0a5;
        auVar222._12_4_ = 0x42b0c0a5;
        auVar232._8_4_ = 0xc2b0c0a5;
        auVar232._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar232._12_4_ = 0xc2b0c0a5;
        auVar204._8_4_ = 0x40000000;
        auVar204._0_8_ = 0x4000000040000000;
        auVar204._12_4_ = 0x40000000;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar27._0_4_ = *pfVar20 * -2.0;
          auVar27._4_4_ = pfVar20[1] * -2.0;
          auVar27._8_4_ = pfVar20[2] * -2.0;
          auVar27._12_4_ = pfVar20[3] * -2.0;
          auVar111 = vminps_avx(auVar27,auVar222);
          auVar131 = vmaxps_avx(auVar111,auVar232);
          auVar112._0_4_ = auVar131._0_4_ * 1.442695 + 0.5;
          auVar112._4_4_ = auVar131._4_4_ * 1.442695 + 0.5;
          auVar112._8_4_ = auVar131._8_4_ * 1.442695 + 0.5;
          auVar112._12_4_ = auVar131._12_4_ * 1.442695 + 0.5;
          auVar143._0_4_ = (int)auVar112._0_4_;
          auVar143._4_4_ = (int)auVar112._4_4_;
          auVar143._8_4_ = (int)auVar112._8_4_;
          auVar143._12_4_ = (int)auVar112._12_4_;
          auVar142 = vcvtdq2ps_avx(auVar143);
          auVar111 = vcmpps_avx(auVar112,auVar142,1);
          auVar111 = vandps_avx(auVar111,auVar181);
          auVar111 = vsubps_avx(auVar142,auVar111);
          fVar26 = auVar131._0_4_ + auVar111._0_4_ * -0.6931472;
          fVar102 = auVar131._4_4_ + auVar111._4_4_ * -0.6931472;
          fVar103 = auVar131._8_4_ + auVar111._8_4_ * -0.6931472;
          fVar105 = auVar131._12_4_ + auVar111._12_4_ * -0.6931472;
          auVar113._0_4_ = (int)auVar111._0_4_;
          auVar113._4_4_ = (int)auVar111._4_4_;
          auVar113._8_4_ = (int)auVar111._8_4_;
          auVar113._12_4_ = (int)auVar111._12_4_;
          auVar111 = vpslld_avx(auVar113,0x17);
          auVar111 = vpaddd_avx(auVar111,auVar181);
          auVar28._0_4_ =
               (fVar26 + 1.0 +
               fVar26 * fVar26 *
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar111._0_4_ + 1.0;
          auVar28._4_4_ =
               (fVar102 + 1.0 +
               fVar102 * fVar102 *
               (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar111._4_4_ + 1.0;
          auVar28._8_4_ =
               (fVar103 + 1.0 +
               fVar103 * fVar103 *
               (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5)) * auVar111._8_4_ + 1.0;
          auVar28._12_4_ =
               (fVar105 + 1.0 +
               fVar105 * fVar105 *
               (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar111._12_4_ + 1.0;
          auVar111 = vrcpps_avx(auVar28);
          fVar26 = auVar111._0_4_;
          fVar102 = auVar111._4_4_;
          fVar103 = auVar111._8_4_;
          fVar105 = auVar111._12_4_;
          auVar29._0_4_ = auVar28._0_4_ * (fVar26 + fVar26);
          auVar29._4_4_ = auVar28._4_4_ * (fVar102 + fVar102);
          auVar29._8_4_ = auVar28._8_4_ * (fVar103 + fVar103);
          auVar29._12_4_ = auVar28._12_4_ * (fVar105 + fVar105);
          auVar111 = vsubps_avx(auVar204,auVar29);
          *pfVar20 = fVar26 + fVar26 + -1.0 + fVar26 * auVar111._0_4_;
          pfVar20[1] = fVar102 + fVar102 + -1.0 + fVar102 * auVar111._4_4_;
          pfVar20[2] = fVar103 + fVar103 + -1.0 + fVar103 * auVar111._8_4_;
          pfVar20[3] = fVar105 + fVar105 + -1.0 + fVar105 * auVar111._12_4_;
          pfVar20 = pfVar20 + 4;
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            fVar26 = tanhf(pfVar20[lVar19]);
            pfVar20[lVar19] = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0x11:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar20;
            afVar49 = (__m256)local_80;
            UnaryOp_x86_avx_functor::unary_op_log10::func_pack8
                      ((unary_op_log10 *)&local_161,(__m256 *)local_80);
            *(__m256 *)pfVar20 = afVar49;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        auVar142._8_4_ = 0x3f000000;
        auVar142._0_8_ = 0x3f0000003f000000;
        auVar142._12_4_ = 0x3f000000;
        auVar131._8_4_ = 0xffffff82;
        auVar131._0_8_ = 0xffffff82ffffff82;
        auVar131._12_4_ = 0xffffff82;
        auVar205._8_4_ = 0x3f3504f3;
        auVar205._0_8_ = 0x3f3504f33f3504f3;
        auVar205._12_4_ = 0x3f3504f3;
        auVar296._8_4_ = 0x3f800000;
        auVar296._0_8_ = 0x3f8000003f800000;
        auVar296._12_4_ = 0x3f800000;
        auVar111._8_4_ = 0x3e4cceac;
        auVar111._0_8_ = 0x3e4cceac3e4cceac;
        auVar111._12_4_ = 0x3e4cceac;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar23) {
          auVar36._8_4_ = 0x800000;
          auVar36._0_8_ = 0x80000000800000;
          auVar36._12_4_ = 0x800000;
          auVar36 = vmaxps_avx(auVar36,*(undefined1 (*) [16])pfVar20);
          auVar127 = vpsrld_avx(auVar36,0x17);
          auVar127 = vpaddd_avx(auVar127,auVar131);
          auVar152._8_4_ = 0x807fffff;
          auVar152._0_8_ = 0x807fffff807fffff;
          auVar152._12_4_ = 0x807fffff;
          auVar36 = vandps_avx(auVar36,auVar152);
          auVar37 = vorps_avx(auVar36,auVar142);
          auVar152 = vcvtdq2ps_avx(auVar127);
          auVar127 = vcmpps_avx(auVar37,auVar205,1);
          auVar36 = vandps_avx(auVar127,auVar37);
          fVar26 = auVar37._0_4_ + -1.0 + auVar36._0_4_;
          fVar102 = auVar37._4_4_ + -1.0 + auVar36._4_4_;
          fVar103 = auVar37._8_4_ + -1.0 + auVar36._8_4_;
          fVar105 = auVar37._12_4_ + -1.0 + auVar36._12_4_;
          auVar36 = vandps_avx(auVar296,auVar127);
          auVar36 = vsubps_avx(auVar152,auVar36);
          auVar127._0_4_ =
               (auVar36._0_4_ * 0.6931472 + fVar26 +
               fVar26 * fVar26 *
               (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                     -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                  0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5)) *
               0.4342945;
          auVar127._4_4_ =
               (auVar36._4_4_ * 0.6931472 + fVar102 +
               fVar102 * fVar102 *
               (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102 +
                     -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102 +
                  0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 + -0.5)) *
               0.4342945;
          auVar127._8_4_ =
               (auVar36._8_4_ * 0.6931472 + fVar103 +
               fVar103 * fVar103 *
               (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) * fVar103 +
                     -0.12420141) * fVar103 + 0.14249323) * fVar103 + -0.16668057) * fVar103 +
                  0.20000714) * fVar103 + -0.24999994) * fVar103 + 0.3333333) * fVar103 + -0.5)) *
               0.4342945;
          auVar127._12_4_ =
               (auVar36._12_4_ * 0.6931472 + fVar105 +
               fVar105 * fVar105 *
               (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) * fVar105 +
                     -0.12420141) * fVar105 + 0.14249323) * fVar105 + -0.16668057) * fVar105 +
                  0.20000714) * fVar105 + -0.24999994) * fVar105 + 0.3333333) * fVar105 + -0.5)) *
               0.4342945;
          *(undefined1 (*) [16])pfVar20 = auVar127;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar111 = vpcmpeqd_avx(auVar111,auVar111);
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar16;
          auVar142 = vpshufd_avx(auVar37,0x44);
          local_c0._16_16_ = auVar142;
          local_c0._0_16_ = auVar142;
          local_d0 = vpor_avx(auVar142,local_f0);
          local_e0 = vpor_avx(auVar142,local_f0);
          uVar25 = 0;
          auVar134 = _DAT_00555120;
          do {
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar25;
            auVar142 = vpshufd_avx(auVar38,0x44);
            auVar57._16_16_ = auVar142;
            auVar57._0_16_ = auVar142;
            auVar58 = vorps_avx(auVar57,_DAT_00555100);
            auVar134 = vorps_avx(auVar57,auVar134);
            auVar205 = vpor_avx(local_c0._16_16_,local_f0);
            auVar142 = vpcmpgtq_avx(auVar134._16_16_ ^ local_f0,auVar205);
            auVar131 = vpcmpgtq_avx(auVar134._0_16_ ^ local_f0,local_d0);
            auVar142 = vpackssdw_avx(auVar131,auVar142);
            auVar131 = vpcmpgtq_avx(auVar58._16_16_ ^ local_f0,auVar205);
            auVar128._0_4_ = auVar58._0_4_ ^ local_f0._0_4_;
            auVar128._4_4_ = auVar58._4_4_ ^ local_f0._4_4_;
            auVar128._8_4_ = auVar58._8_4_ ^ local_f0._8_4_;
            auVar128._12_4_ = auVar58._12_4_ ^ local_f0._12_4_;
            auVar205 = vpcmpgtq_avx(auVar128,local_e0);
            auVar131 = vpackssdw_avx(auVar205,auVar131);
            auVar142 = vpackssdw_avx(auVar131 ^ auVar111,auVar142 ^ auVar111);
            auVar131 = vpmovsxwd_avx(auVar142);
            auVar142 = vpunpckhwd_avx(auVar142,auVar142);
            local_a0._16_16_ = auVar142;
            local_a0._0_16_ = auVar131;
            local_120 = vmaskmovps_avx(local_a0,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = log10f(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_05;
            local_160._8_4_ = extraout_XMM0_Dc_05;
            local_160._12_4_ = extraout_XMM0_Dd_05;
            auVar142 = vmovshdup_avx(local_150);
            auVar84._0_4_ = log10f(auVar142._0_4_);
            auVar84._4_60_ = extraout_var_17;
            local_160 = vinsertps_avx(local_160,auVar84._0_16_,0x10);
            auVar142 = vpermilpd_avx(local_150,1);
            auVar85._0_4_ = log10f(auVar142._0_4_);
            auVar85._4_60_ = extraout_var_18;
            local_160 = vinsertps_avx(local_160,auVar85._0_16_,0x20);
            auVar142 = vpermilps_avx(local_150,0xff);
            auVar86._0_4_ = log10f(auVar142._0_4_);
            auVar86._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_160,auVar86._0_16_,0x30);
            local_160._0_4_ = log10f((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_06;
            local_160._8_4_ = extraout_XMM0_Dc_06;
            local_160._12_4_ = extraout_XMM0_Dd_06;
            auVar142 = vmovshdup_avx(local_120._0_16_);
            auVar87._0_4_ = log10f(auVar142._0_4_);
            auVar87._4_60_ = extraout_var_20;
            local_160 = vinsertps_avx(local_160,auVar87._0_16_,0x10);
            auVar142 = vpermilpd_avx(local_120._0_16_,1);
            auVar88._0_4_ = log10f(auVar142._0_4_);
            auVar88._4_60_ = extraout_var_21;
            local_160 = vinsertps_avx(local_160,auVar88._0_16_,0x20);
            auVar142 = vpermilps_avx(local_120._0_16_,0xff);
            auVar89._0_4_ = log10f(auVar142._0_4_);
            auVar134 = _DAT_00555120;
            auVar89._4_60_ = extraout_var_22;
            auVar111 = vpcmpeqd_avx(auVar111,auVar111);
            auVar142 = vinsertps_avx(local_160,auVar89._0_16_,0x30);
            auVar58._16_16_ = local_150;
            auVar58._0_16_ = auVar142;
            auVar58 = vmaskmovps_avx(local_a0,auVar58);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar58;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}